

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O2

void embree::avx512::ConeCurveMiIntersectorK<8,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *line)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Scene *pSVar10;
  Geometry *pGVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  byte bVar81;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  byte bVar89;
  byte bVar90;
  uint uVar91;
  uint uVar92;
  undefined1 auVar93 [8];
  uint uVar94;
  byte bVar95;
  byte bVar96;
  ulong uVar97;
  ulong uVar98;
  ulong uVar99;
  ulong uVar100;
  ulong uVar101;
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined4 uVar144;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [64];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar158 [36];
  undefined1 auVar159 [28];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [64];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  float fVar171;
  undefined1 auVar169 [32];
  undefined1 auVar170 [64];
  float fVar172;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar174 [64];
  undefined1 auVar181 [32];
  undefined1 auVar182 [64];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<8> hit;
  undefined1 local_5e0 [16];
  Primitive *local_5c8;
  RTCFilterFunctionNArguments local_5c0;
  undefined1 local_590 [16];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  RayQueryContext *local_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  uint local_500 [4];
  uint uStack_4f0;
  uint uStack_4ec;
  uint uStack_4e8;
  uint uStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  uint local_4a0 [4];
  uint uStack_490;
  uint uStack_48c;
  uint uStack_488;
  uint uStack_484;
  uint local_480 [4];
  uint uStack_470;
  uint uStack_46c;
  uint uStack_468;
  uint uStack_464;
  uint local_460 [4];
  uint uStack_450;
  uint uStack_44c;
  uint uStack_448;
  uint uStack_444;
  RTCHitN local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined4 local_400;
  undefined4 uStack_3fc;
  undefined4 uStack_3f8;
  undefined4 uStack_3f4;
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  uint local_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  uint uStack_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined1 local_a0 [32];
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  int iVar102;
  int iVar137;
  int iVar138;
  int iVar139;
  int iVar140;
  int iVar141;
  int iVar142;
  int iVar143;
  undefined1 auVar157 [64];
  undefined1 auVar173 [32];
  
  pSVar10 = context->scene;
  pGVar11 = (pSVar10->geometries).items[line->sharedGeomID].ptr;
  uVar91 = (line->v0).field_0.i[0];
  lVar12 = *(long *)&pGVar11[1].time_range.upper;
  p_Var13 = pGVar11[1].intersectionFilterN;
  uVar92 = (line->v0).field_0.i[1];
  uVar94 = (line->v0).field_0.i[2];
  uVar5 = (line->v0).field_0.i[3];
  uVar6 = (line->v0).field_0.i[4];
  auVar116._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar6 * (long)p_Var13);
  auVar116._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar91 * (long)p_Var13);
  uVar7 = (line->v0).field_0.i[5];
  auVar134._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar7 * (long)p_Var13);
  auVar134._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar92 * (long)p_Var13);
  uVar8 = (line->v0).field_0.i[6];
  auVar112._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar8 * (long)p_Var13);
  auVar112._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar94 * (long)p_Var13);
  uVar9 = (line->v0).field_0.i[7];
  auVar113._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar9 * (long)p_Var13);
  auVar113._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar5 * (long)p_Var13);
  auVar103 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar6 + 1) * (long)p_Var13);
  auVar127._0_16_ =
       ZEXT116(0) * auVar103 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar91 + 1) * (long)p_Var13);
  auVar127._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar103;
  auVar103 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar7 + 1) * (long)p_Var13);
  auVar155._0_16_ =
       ZEXT116(0) * auVar103 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar92 + 1) * (long)p_Var13);
  auVar155._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar103;
  auVar103 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar8 + 1) * (long)p_Var13);
  auVar160._0_16_ =
       ZEXT116(0) * auVar103 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar94 + 1) * (long)p_Var13);
  auVar160._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar103;
  auVar103 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar9 + 1) * (long)p_Var13);
  auVar162._0_16_ =
       ZEXT116(0) * auVar103 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar5 + 1) * (long)p_Var13);
  auVar162._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar103;
  local_e0 = vpbroadcastd_avx512vl();
  auVar109 = vunpcklps_avx(auVar116,auVar112);
  auVar107 = vunpckhps_avx(auVar116,auVar112);
  auVar116 = vunpcklps_avx(auVar134,auVar113);
  auVar108 = vunpckhps_avx(auVar134,auVar113);
  auVar112 = vunpcklps_avx(auVar109,auVar116);
  auVar116 = vunpckhps_avx(auVar109,auVar116);
  auVar113 = vunpcklps_avx(auVar107,auVar108);
  auVar134 = vunpckhps_avx(auVar107,auVar108);
  auVar109 = vpunpckldq_avx2(auVar127,auVar160);
  auVar107 = vpunpckhdq_avx2(auVar127,auVar160);
  auVar127 = vpunpckldq_avx2(auVar155,auVar162);
  auVar108 = vpunpckhdq_avx2(auVar155,auVar162);
  auVar160 = vpunpckldq_avx2(auVar109,auVar127);
  auVar127 = vpunpckhdq_avx2(auVar109,auVar127);
  auVar162 = vpunpckldq_avx2(auVar107,auVar108);
  auVar155 = vpunpckhdq_avx2(auVar107,auVar108);
  auVar107 = vpcmpeqd_avx2(auVar109,auVar109);
  uVar98 = vpcmpd_avx512vl(auVar107,(undefined1  [32])(line->primIDs).field_0,4);
  fVar1 = *(float *)(ray + k * 4);
  auVar111._4_4_ = fVar1;
  auVar111._0_4_ = fVar1;
  auVar111._8_4_ = fVar1;
  auVar111._12_4_ = fVar1;
  auVar111._16_4_ = fVar1;
  auVar111._20_4_ = fVar1;
  auVar111._24_4_ = fVar1;
  auVar111._28_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x10);
  auVar114._4_4_ = fVar2;
  auVar114._0_4_ = fVar2;
  auVar114._8_4_ = fVar2;
  auVar114._12_4_ = fVar2;
  auVar114._16_4_ = fVar2;
  auVar114._20_4_ = fVar2;
  auVar114._24_4_ = fVar2;
  auVar114._28_4_ = fVar2;
  fVar3 = *(float *)(ray + k * 4 + 0x20);
  auVar115._4_4_ = fVar3;
  auVar115._0_4_ = fVar3;
  auVar115._8_4_ = fVar3;
  auVar115._12_4_ = fVar3;
  auVar115._16_4_ = fVar3;
  auVar115._20_4_ = fVar3;
  auVar115._24_4_ = fVar3;
  auVar115._28_4_ = fVar3;
  auVar104 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
  auVar194 = ZEXT3264(auVar104);
  auVar105 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
  auVar195 = ZEXT3264(auVar105);
  auVar106 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
  auVar196 = ZEXT3264(auVar106);
  auVar103 = vmulss_avx512f(auVar106._0_16_,auVar106._0_16_);
  auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar103),auVar105,auVar105);
  auVar107 = vfmadd231ps_avx512vl(auVar107,auVar104,auVar104);
  auVar109._0_4_ = auVar107._0_4_;
  auVar109._4_4_ = auVar109._0_4_;
  auVar109._8_4_ = auVar109._0_4_;
  auVar109._12_4_ = auVar109._0_4_;
  auVar109._16_4_ = auVar109._0_4_;
  auVar109._20_4_ = auVar109._0_4_;
  auVar109._24_4_ = auVar109._0_4_;
  auVar109._28_4_ = auVar109._0_4_;
  auVar108 = vrcp14ps_avx512vl(auVar109);
  auVar107._8_4_ = 0x3f800000;
  auVar107._0_8_ = 0x3f8000003f800000;
  auVar107._12_4_ = 0x3f800000;
  auVar107._16_4_ = 0x3f800000;
  auVar107._20_4_ = 0x3f800000;
  auVar107._24_4_ = 0x3f800000;
  auVar107._28_4_ = 0x3f800000;
  auVar107 = vfnmadd213ps_avx512vl(auVar109,auVar108,auVar107);
  auVar103 = vfmadd132ps_fma(auVar107,auVar108,auVar108);
  auVar110._0_4_ = auVar112._0_4_ + auVar160._0_4_;
  auVar110._4_4_ = auVar112._4_4_ + auVar160._4_4_;
  auVar110._8_4_ = auVar112._8_4_ + auVar160._8_4_;
  auVar110._12_4_ = auVar112._12_4_ + auVar160._12_4_;
  auVar110._16_4_ = auVar112._16_4_ + auVar160._16_4_;
  auVar110._20_4_ = auVar112._20_4_ + auVar160._20_4_;
  auVar110._24_4_ = auVar112._24_4_ + auVar160._24_4_;
  auVar110._28_4_ = auVar112._28_4_ + auVar160._28_4_;
  auVar117._0_4_ = auVar127._0_4_ + auVar116._0_4_;
  auVar117._4_4_ = auVar127._4_4_ + auVar116._4_4_;
  auVar117._8_4_ = auVar127._8_4_ + auVar116._8_4_;
  auVar117._12_4_ = auVar127._12_4_ + auVar116._12_4_;
  auVar117._16_4_ = auVar127._16_4_ + auVar116._16_4_;
  auVar117._20_4_ = auVar127._20_4_ + auVar116._20_4_;
  auVar117._24_4_ = auVar127._24_4_ + auVar116._24_4_;
  auVar117._28_4_ = auVar127._28_4_ + auVar116._28_4_;
  auVar118._0_4_ = auVar113._0_4_ + auVar162._0_4_;
  auVar118._4_4_ = auVar113._4_4_ + auVar162._4_4_;
  auVar118._8_4_ = auVar113._8_4_ + auVar162._8_4_;
  auVar118._12_4_ = auVar113._12_4_ + auVar162._12_4_;
  auVar118._16_4_ = auVar113._16_4_ + auVar162._16_4_;
  auVar118._20_4_ = auVar113._20_4_ + auVar162._20_4_;
  auVar118._24_4_ = auVar113._24_4_ + auVar162._24_4_;
  auVar118._28_4_ = auVar113._28_4_ + auVar162._28_4_;
  auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar108 = vmulps_avx512vl(auVar110,auVar107);
  auVar109 = vmulps_avx512vl(auVar117,auVar107);
  auVar110 = vmulps_avx512vl(auVar118,auVar107);
  auVar107 = vsubps_avx(auVar108,auVar111);
  auVar108 = vsubps_avx(auVar109,auVar114);
  auVar109 = vsubps_avx(auVar110,auVar115);
  auVar109 = vmulps_avx512vl(auVar109,auVar106);
  auVar108 = vfmadd231ps_avx512vl(auVar109,auVar105,auVar108);
  auVar107 = vfmadd231ps_avx512vl(auVar108,auVar104,auVar107);
  auVar145._0_4_ = auVar107._0_4_ * auVar103._0_4_;
  auVar145._4_4_ = auVar107._4_4_ * auVar103._4_4_;
  auVar145._8_4_ = auVar107._8_4_ * auVar103._8_4_;
  auVar145._12_4_ = auVar107._12_4_ * auVar103._12_4_;
  auVar145._16_4_ = auVar107._16_4_ * 0.0;
  auVar145._20_4_ = auVar107._20_4_ * 0.0;
  auVar145._24_4_ = auVar107._24_4_ * 0.0;
  auVar145._28_4_ = 0;
  auVar107 = vmulps_avx512vl(auVar104,auVar145);
  auVar108 = vmulps_avx512vl(auVar105,auVar145);
  auVar109 = vmulps_avx512vl(auVar106,auVar145);
  auVar121._0_4_ = auVar107._0_4_ + fVar1;
  auVar121._4_4_ = auVar107._4_4_ + fVar1;
  auVar121._8_4_ = auVar107._8_4_ + fVar1;
  auVar121._12_4_ = auVar107._12_4_ + fVar1;
  auVar121._16_4_ = auVar107._16_4_ + fVar1;
  auVar121._20_4_ = auVar107._20_4_ + fVar1;
  auVar121._24_4_ = auVar107._24_4_ + fVar1;
  auVar121._28_4_ = auVar107._28_4_ + fVar1;
  auVar122._0_4_ = auVar108._0_4_ + fVar2;
  auVar122._4_4_ = auVar108._4_4_ + fVar2;
  auVar122._8_4_ = auVar108._8_4_ + fVar2;
  auVar122._12_4_ = auVar108._12_4_ + fVar2;
  auVar122._16_4_ = auVar108._16_4_ + fVar2;
  auVar122._20_4_ = auVar108._20_4_ + fVar2;
  auVar122._24_4_ = auVar108._24_4_ + fVar2;
  auVar122._28_4_ = auVar108._28_4_ + fVar2;
  auVar123._0_4_ = fVar3 + auVar109._0_4_;
  auVar123._4_4_ = fVar3 + auVar109._4_4_;
  auVar123._8_4_ = fVar3 + auVar109._8_4_;
  auVar123._12_4_ = fVar3 + auVar109._12_4_;
  auVar123._16_4_ = fVar3 + auVar109._16_4_;
  auVar123._20_4_ = fVar3 + auVar109._20_4_;
  auVar123._24_4_ = fVar3 + auVar109._24_4_;
  auVar123._28_4_ = fVar3 + auVar109._28_4_;
  auVar109 = vsubps_avx512vl(auVar160,auVar112);
  auVar197 = ZEXT3264(auVar109);
  auVar110 = vsubps_avx512vl(auVar127,auVar116);
  auVar198 = ZEXT3264(auVar110);
  auVar111 = vsubps_avx512vl(auVar162,auVar113);
  auVar199 = ZEXT3264(auVar111);
  _local_580 = vsubps_avx(auVar121,auVar112);
  auVar112 = vsubps_avx512vl(auVar122,auVar116);
  auVar201 = ZEXT3264(auVar112);
  _local_540 = vsubps_avx512vl(auVar123,auVar113);
  auVar107 = vmulps_avx512vl(auVar111,auVar111);
  auVar107 = vfmadd231ps_avx512vl(auVar107,auVar110,auVar110);
  auVar113 = vfmadd231ps_avx512vl(auVar107,auVar109,auVar109);
  auVar107 = vmulps_avx512vl(auVar111,_local_540);
  auVar107 = vfmadd231ps_avx512vl(auVar107,auVar112,auVar110);
  auVar114 = vfmadd231ps_avx512vl(auVar107,_local_580,auVar109);
  auVar107 = vmulps_avx512vl(auVar111,auVar106);
  auVar107 = vfmadd231ps_avx512vl(auVar107,auVar105,auVar110);
  auVar115 = vfmadd231ps_avx512vl(auVar107,auVar104,auVar109);
  auVar107 = vsubps_avx(auVar134,auVar155);
  fVar1 = auVar107._0_4_;
  fVar3 = auVar107._4_4_;
  fVar62 = auVar107._8_4_;
  fVar65 = auVar107._12_4_;
  fVar68 = auVar107._16_4_;
  fVar71 = auVar107._20_4_;
  fVar74 = auVar107._24_4_;
  auVar149._0_4_ = fVar1 * fVar1 + auVar113._0_4_;
  auVar149._4_4_ = fVar3 * fVar3 + auVar113._4_4_;
  auVar149._8_4_ = fVar62 * fVar62 + auVar113._8_4_;
  auVar149._12_4_ = fVar65 * fVar65 + auVar113._12_4_;
  auVar149._16_4_ = fVar68 * fVar68 + auVar113._16_4_;
  auVar149._20_4_ = fVar71 * fVar71 + auVar113._20_4_;
  auVar149._24_4_ = fVar74 * fVar74 + auVar113._24_4_;
  auVar149._28_4_ = auVar116._28_4_ + auVar113._28_4_;
  auVar108 = vmulps_avx512vl(auVar106,_local_540);
  auVar108 = vfmadd231ps_avx512vl(auVar108,auVar105,auVar112);
  auVar116 = vfmadd231ps_avx512vl(auVar108,auVar104,_local_580);
  auVar108 = vmulps_avx512vl(_local_540,_local_540);
  auVar108 = vfmadd231ps_avx512vl(auVar108,auVar112,auVar112);
  auVar117 = vfmadd231ps_avx512vl(auVar108,_local_580,_local_580);
  auVar118 = vmulps_avx512vl(auVar113,auVar113);
  auVar202 = ZEXT3264(auVar118);
  auVar119 = vmulps_avx512vl(auVar134,auVar113);
  fVar2 = auVar115._0_4_;
  fVar172 = fVar2 * fVar2;
  fVar60 = auVar115._4_4_;
  fVar175 = fVar60 * fVar60;
  auVar108._4_4_ = fVar175;
  auVar108._0_4_ = fVar172;
  fVar63 = auVar115._8_4_;
  fVar176 = fVar63 * fVar63;
  auVar108._8_4_ = fVar176;
  fVar66 = auVar115._12_4_;
  fVar177 = fVar66 * fVar66;
  auVar108._12_4_ = fVar177;
  fVar69 = auVar115._16_4_;
  fVar178 = fVar69 * fVar69;
  auVar108._16_4_ = fVar178;
  fVar72 = auVar115._20_4_;
  fVar179 = fVar72 * fVar72;
  auVar108._20_4_ = fVar179;
  fVar75 = auVar115._24_4_;
  fVar180 = fVar75 * fVar75;
  auVar108._24_4_ = fVar180;
  auVar108._28_4_ = local_580._28_4_;
  auVar108 = vmulps_avx512vl(auVar149,auVar108);
  auVar108 = vsubps_avx512vl(auVar118,auVar108);
  auVar116 = vmulps_avx512vl(auVar118,auVar116);
  auVar120 = vmulps_avx512vl(auVar115,auVar114);
  auVar120 = vmulps_avx512vl(auVar149,auVar120);
  auVar116 = vsubps_avx512vl(auVar116,auVar120);
  auVar120 = vmulps_avx512vl(auVar107,auVar115);
  auVar120 = vmulps_avx512vl(auVar119,auVar120);
  auVar116 = vaddps_avx512vl(auVar120,auVar116);
  auVar117 = vmulps_avx512vl(auVar118,auVar117);
  auVar120 = vmulps_avx512vl(auVar114,auVar114);
  auVar120 = vmulps_avx512vl(auVar149,auVar120);
  auVar117 = vsubps_avx512vl(auVar117,auVar120);
  auVar107 = vaddps_avx512vl(auVar107,auVar107);
  auVar107 = vmulps_avx512vl(auVar107,auVar114);
  auVar107 = vsubps_avx512vl(auVar107,auVar119);
  auVar107 = vmulps_avx512vl(auVar119,auVar107);
  auVar107 = vaddps_avx512vl(auVar117,auVar107);
  auVar117 = vmulps_avx512vl(auVar116,auVar116);
  auVar107 = vmulps_avx512vl(auVar108,auVar107);
  auVar107 = vsubps_avx512vl(auVar117,auVar107);
  auVar117 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  uVar101 = vcmpps_avx512vl(auVar107,auVar117,5);
  bVar90 = (byte)(uVar98 & uVar101);
  if (bVar90 == 0) {
    return;
  }
  auVar160 = vsubps_avx(auVar121,auVar160);
  auVar127 = vsubps_avx(auVar122,auVar127);
  auVar162 = vsubps_avx(auVar123,auVar162);
  auVar121 = vsqrtps_avx512vl(auVar107);
  auVar122 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar107 = vrcp14ps_avx512vl(auVar108);
  auVar123 = vfnmadd213ps_avx512vl(auVar107,auVar108,auVar122);
  auVar119._8_4_ = 0x7fffffff;
  auVar119._0_8_ = 0x7fffffff7fffffff;
  auVar119._12_4_ = 0x7fffffff;
  auVar119._16_4_ = 0x7fffffff;
  auVar119._20_4_ = 0x7fffffff;
  auVar119._24_4_ = 0x7fffffff;
  auVar119._28_4_ = 0x7fffffff;
  vandps_avx512vl(auVar108,auVar119);
  auVar120._8_4_ = 0x219392ef;
  auVar120._0_8_ = 0x219392ef219392ef;
  auVar120._12_4_ = 0x219392ef;
  auVar120._16_4_ = 0x219392ef;
  auVar120._20_4_ = 0x219392ef;
  auVar120._24_4_ = 0x219392ef;
  auVar120._28_4_ = 0x219392ef;
  uVar97 = vcmpps_avx512vl(auVar123,auVar120,2);
  auVar108 = vfmadd132ps_avx512vl(auVar123,auVar107,auVar107);
  auVar156._8_4_ = 0x80000000;
  auVar156._0_8_ = 0x8000000080000000;
  auVar156._12_4_ = 0x80000000;
  auVar156._16_4_ = 0x80000000;
  auVar156._20_4_ = 0x80000000;
  auVar156._24_4_ = 0x80000000;
  auVar156._28_4_ = 0x80000000;
  auVar157 = ZEXT3264(auVar156);
  auVar107 = vxorps_avx512vl(auVar116,auVar156);
  auVar107 = vsubps_avx(auVar107,auVar121);
  auVar107 = vmulps_avx512vl(auVar107,auVar108);
  auVar183._8_4_ = 0xff800000;
  auVar183._0_8_ = 0xff800000ff800000;
  auVar183._12_4_ = 0xff800000;
  auVar183._16_4_ = 0xff800000;
  auVar183._20_4_ = 0xff800000;
  auVar183._24_4_ = 0xff800000;
  auVar183._28_4_ = 0xff800000;
  bVar14 = (bool)((byte)uVar97 & 1);
  auVar124._0_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar107._0_4_;
  bVar14 = (bool)((byte)(uVar97 >> 1) & 1);
  auVar124._4_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar107._4_4_;
  bVar14 = (bool)((byte)(uVar97 >> 2) & 1);
  auVar124._8_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar107._8_4_;
  bVar14 = (bool)((byte)(uVar97 >> 3) & 1);
  auVar124._12_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar107._12_4_;
  bVar14 = (bool)((byte)(uVar97 >> 4) & 1);
  auVar124._16_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar107._16_4_;
  bVar14 = (bool)((byte)(uVar97 >> 5) & 1);
  auVar124._20_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar107._20_4_;
  bVar14 = (bool)((byte)(uVar97 >> 6) & 1);
  auVar124._24_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar107._24_4_;
  bVar14 = SUB81(uVar97 >> 7,0);
  auVar124._28_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar107._28_4_;
  auVar107 = vsubps_avx512vl(auVar121,auVar116);
  auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
  auVar193 = ZEXT3264(auVar119);
  auVar107 = vmulps_avx512vl(auVar107,auVar108);
  bVar14 = (bool)((byte)uVar97 & 1);
  iVar102 = auVar119._0_4_;
  auVar125._0_4_ = (uint)bVar14 * iVar102 | (uint)!bVar14 * auVar107._0_4_;
  bVar14 = (bool)((byte)(uVar97 >> 1) & 1);
  iVar137 = auVar119._4_4_;
  auVar125._4_4_ = (uint)bVar14 * iVar137 | (uint)!bVar14 * auVar107._4_4_;
  bVar14 = (bool)((byte)(uVar97 >> 2) & 1);
  iVar138 = auVar119._8_4_;
  auVar125._8_4_ = (uint)bVar14 * iVar138 | (uint)!bVar14 * auVar107._8_4_;
  bVar14 = (bool)((byte)(uVar97 >> 3) & 1);
  iVar139 = auVar119._12_4_;
  auVar125._12_4_ = (uint)bVar14 * iVar139 | (uint)!bVar14 * auVar107._12_4_;
  bVar14 = (bool)((byte)(uVar97 >> 4) & 1);
  iVar140 = auVar119._16_4_;
  auVar125._16_4_ = (uint)bVar14 * iVar140 | (uint)!bVar14 * auVar107._16_4_;
  bVar14 = (bool)((byte)(uVar97 >> 5) & 1);
  iVar141 = auVar119._20_4_;
  auVar125._20_4_ = (uint)bVar14 * iVar141 | (uint)!bVar14 * auVar107._20_4_;
  bVar14 = (bool)((byte)(uVar97 >> 6) & 1);
  iVar142 = auVar119._24_4_;
  iVar143 = auVar119._28_4_;
  auVar125._24_4_ = (uint)bVar14 * iVar142 | (uint)!bVar14 * auVar107._24_4_;
  bVar14 = SUB81(uVar97 >> 7,0);
  auVar125._28_4_ = (uint)bVar14 * iVar143 | (uint)!bVar14 * auVar107._28_4_;
  auVar107 = vmulps_avx512vl(auVar115,auVar124);
  auVar181._0_4_ = auVar114._0_4_ + auVar107._0_4_;
  auVar181._4_4_ = auVar114._4_4_ + auVar107._4_4_;
  auVar181._8_4_ = auVar114._8_4_ + auVar107._8_4_;
  auVar181._12_4_ = auVar114._12_4_ + auVar107._12_4_;
  auVar181._16_4_ = auVar114._16_4_ + auVar107._16_4_;
  auVar181._20_4_ = auVar114._20_4_ + auVar107._20_4_;
  auVar181._24_4_ = auVar114._24_4_ + auVar107._24_4_;
  fVar171 = auVar114._28_4_;
  auVar181._28_4_ = fVar171 + auVar107._28_4_;
  auVar107 = vmulps_avx512vl(auVar115,auVar125);
  auVar120 = vaddps_avx512vl(auVar114,auVar107);
  uVar77 = vcmpps_avx512vl(auVar181,auVar113,1);
  uVar78 = vcmpps_avx512vl(auVar181,auVar117,6);
  uVar79 = vcmpps_avx512vl(auVar120,auVar113,1);
  uVar80 = vcmpps_avx512vl(auVar120,auVar117,6);
  auVar174._0_4_ = fVar2 * (float)local_580._0_4_;
  auVar174._4_4_ = fVar60 * (float)local_580._4_4_;
  auVar174._8_4_ = fVar63 * fStack_578;
  auVar174._12_4_ = fVar66 * fStack_574;
  auVar174._16_4_ = fVar69 * fStack_570;
  auVar174._20_4_ = fVar72 * fStack_56c;
  auVar174._28_36_ = SUB4836((undefined1  [48])0x0,0xc);
  auVar174._24_4_ = fVar75 * fStack_568;
  auVar107 = vmulps_avx512vl(auVar115,auVar112);
  auVar108 = vmulps_avx512vl(auVar115,_local_540);
  auVar116 = vmulps_avx512vl(auVar104,auVar114);
  auVar116 = vsubps_avx512vl(auVar174._0_32_,auVar116);
  auVar117 = vmulps_avx512vl(auVar105,auVar114);
  auVar107 = vsubps_avx512vl(auVar107,auVar117);
  auVar117 = vmulps_avx512vl(auVar106,auVar114);
  auVar108 = vsubps_avx512vl(auVar108,auVar117);
  auVar108 = vmulps_avx512vl(auVar108,auVar108);
  auVar107 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
  auVar107 = vfmadd231ps_avx512vl(auVar107,auVar116,auVar116);
  fVar59 = auVar134._0_4_;
  fVar61 = auVar134._4_4_;
  fVar64 = auVar134._8_4_;
  fVar67 = auVar134._12_4_;
  fVar70 = auVar134._16_4_;
  fVar73 = auVar134._20_4_;
  fVar76 = auVar134._24_4_;
  auVar82._4_4_ = fVar61 * fVar61 * fVar175;
  auVar82._0_4_ = fVar59 * fVar59 * fVar172;
  auVar82._8_4_ = fVar64 * fVar64 * fVar176;
  auVar82._12_4_ = fVar67 * fVar67 * fVar177;
  auVar82._16_4_ = fVar70 * fVar70 * fVar178;
  auVar82._20_4_ = fVar73 * fVar73 * fVar179;
  auVar82._24_4_ = fVar76 * fVar76 * fVar180;
  auVar82._28_4_ = auVar116._28_4_;
  uVar97 = vcmpps_avx512vl(auVar107,auVar82,1);
  uVar97 = (bVar90 & ~(byte)line->leftExists) & uVar97;
  auVar107 = vrcp14ps_avx512vl(auVar115);
  auVar108 = vfnmadd213ps_avx512vl(auVar107,auVar115,auVar122);
  auVar117 = vfmadd132ps_avx512vl(auVar108,auVar107,auVar107);
  auVar165._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
  auVar165._8_4_ = -auVar114._8_4_;
  auVar165._12_4_ = -auVar114._12_4_;
  auVar165._16_4_ = -auVar114._16_4_;
  auVar165._20_4_ = -auVar114._20_4_;
  auVar165._24_4_ = -auVar114._24_4_;
  auVar165._28_4_ = -fVar171;
  auVar107 = vmulps_avx512vl(auVar117,auVar165);
  bVar14 = (bool)((byte)uVar97 & 1);
  auVar126._0_4_ = (uint)bVar14 * auVar107._0_4_ | (uint)!bVar14 * iVar102;
  bVar14 = (bool)((byte)(uVar97 >> 1) & 1);
  auVar126._4_4_ = (uint)bVar14 * auVar107._4_4_ | (uint)!bVar14 * iVar137;
  bVar14 = (bool)((byte)(uVar97 >> 2) & 1);
  auVar126._8_4_ = (uint)bVar14 * auVar107._8_4_ | (uint)!bVar14 * iVar138;
  bVar14 = (bool)((byte)(uVar97 >> 3) & 1);
  auVar126._12_4_ = (uint)bVar14 * auVar107._12_4_ | (uint)!bVar14 * iVar139;
  bVar14 = (bool)((byte)(uVar97 >> 4) & 1);
  auVar126._16_4_ = (uint)bVar14 * auVar107._16_4_ | (uint)!bVar14 * iVar140;
  bVar14 = (bool)((byte)(uVar97 >> 5) & 1);
  auVar126._20_4_ = (uint)bVar14 * auVar107._20_4_ | (uint)!bVar14 * iVar141;
  bVar14 = (bool)((byte)(uVar97 >> 6) & 1);
  auVar126._24_4_ = (uint)bVar14 * auVar107._24_4_ | (uint)!bVar14 * iVar142;
  bVar14 = SUB81(uVar97 >> 7,0);
  auVar126._28_4_ = (uint)bVar14 * auVar107._28_4_ | (uint)!bVar14 * iVar143;
  auVar192 = ZEXT3264(auVar126);
  auVar107 = vmulps_avx512vl(auVar111,auVar162);
  auVar107 = vfmadd231ps_avx512vl(auVar107,auVar127,auVar110);
  auVar114 = vfmadd231ps_avx512vl(auVar107,auVar160,auVar109);
  auVar83._4_4_ = auVar160._4_4_ * fVar60;
  auVar83._0_4_ = auVar160._0_4_ * fVar2;
  auVar83._8_4_ = auVar160._8_4_ * fVar63;
  auVar83._12_4_ = auVar160._12_4_ * fVar66;
  auVar83._16_4_ = auVar160._16_4_ * fVar69;
  auVar83._20_4_ = auVar160._20_4_ * fVar72;
  auVar83._24_4_ = auVar160._24_4_ * fVar75;
  auVar83._28_4_ = fVar171;
  auVar84._4_4_ = auVar127._4_4_ * fVar60;
  auVar84._0_4_ = auVar127._0_4_ * fVar2;
  auVar84._8_4_ = auVar127._8_4_ * fVar63;
  auVar84._12_4_ = auVar127._12_4_ * fVar66;
  auVar84._16_4_ = auVar127._16_4_ * fVar69;
  auVar84._20_4_ = auVar127._20_4_ * fVar72;
  auVar84._24_4_ = auVar127._24_4_ * fVar75;
  auVar84._28_4_ = auVar160._28_4_;
  auVar85._4_4_ = auVar162._4_4_ * fVar60;
  auVar85._0_4_ = auVar162._0_4_ * fVar2;
  auVar85._8_4_ = auVar162._8_4_ * fVar63;
  auVar85._12_4_ = auVar162._12_4_ * fVar66;
  auVar85._16_4_ = auVar162._16_4_ * fVar69;
  auVar85._20_4_ = auVar162._20_4_ * fVar72;
  auVar85._24_4_ = auVar162._24_4_ * fVar75;
  auVar85._28_4_ = auVar115._28_4_;
  auVar107 = vmulps_avx512vl(auVar104,auVar114);
  auVar107 = vsubps_avx(auVar83,auVar107);
  auVar108 = vmulps_avx512vl(auVar105,auVar114);
  auVar108 = vsubps_avx(auVar84,auVar108);
  auVar127 = vmulps_avx512vl(auVar106,auVar114);
  auVar116 = vsubps_avx(auVar85,auVar127);
  auVar86._4_4_ = auVar116._4_4_ * auVar116._4_4_;
  auVar86._0_4_ = auVar116._0_4_ * auVar116._0_4_;
  auVar86._8_4_ = auVar116._8_4_ * auVar116._8_4_;
  auVar86._12_4_ = auVar116._12_4_ * auVar116._12_4_;
  auVar86._16_4_ = auVar116._16_4_ * auVar116._16_4_;
  auVar86._20_4_ = auVar116._20_4_ * auVar116._20_4_;
  auVar86._24_4_ = auVar116._24_4_ * auVar116._24_4_;
  auVar86._28_4_ = auVar116._28_4_;
  auVar103 = vfmadd231ps_fma(auVar86,auVar108,auVar108);
  auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar107,auVar107);
  auVar87._4_4_ = fVar175 * auVar155._4_4_ * auVar155._4_4_;
  auVar87._0_4_ = fVar172 * auVar155._0_4_ * auVar155._0_4_;
  auVar87._8_4_ = fVar176 * auVar155._8_4_ * auVar155._8_4_;
  auVar87._12_4_ = fVar177 * auVar155._12_4_ * auVar155._12_4_;
  auVar87._16_4_ = fVar178 * auVar155._16_4_ * auVar155._16_4_;
  auVar87._20_4_ = fVar179 * auVar155._20_4_ * auVar155._20_4_;
  auVar87._24_4_ = fVar180 * auVar155._24_4_ * auVar155._24_4_;
  auVar87._28_4_ = auVar155._28_4_;
  uVar144 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar169._4_4_ = uVar144;
  auVar169._0_4_ = uVar144;
  auVar169._8_4_ = uVar144;
  auVar169._12_4_ = uVar144;
  auVar169._16_4_ = uVar144;
  auVar169._20_4_ = uVar144;
  auVar169._24_4_ = uVar144;
  auVar169._28_4_ = uVar144;
  bVar96 = (byte)uVar77 & (byte)uVar78 & bVar90;
  auVar107 = vblendmps_avx512vl(auVar119,auVar124);
  auVar128._0_4_ = (uint)(bVar96 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar108._0_4_;
  bVar14 = (bool)(bVar96 >> 1 & 1);
  auVar128._4_4_ = (uint)bVar14 * auVar107._4_4_ | (uint)!bVar14 * auVar108._4_4_;
  bVar14 = (bool)(bVar96 >> 2 & 1);
  auVar128._8_4_ = (uint)bVar14 * auVar107._8_4_ | (uint)!bVar14 * auVar108._8_4_;
  bVar14 = (bool)(bVar96 >> 3 & 1);
  auVar128._12_4_ = (uint)bVar14 * auVar107._12_4_ | (uint)!bVar14 * auVar108._12_4_;
  bVar14 = (bool)(bVar96 >> 4 & 1);
  auVar128._16_4_ = (uint)bVar14 * auVar107._16_4_ | (uint)!bVar14 * auVar108._16_4_;
  bVar14 = (bool)(bVar96 >> 5 & 1);
  auVar128._20_4_ = (uint)bVar14 * auVar107._20_4_ | (uint)!bVar14 * auVar108._20_4_;
  bVar14 = (bool)(bVar96 >> 6 & 1);
  auVar128._24_4_ = (uint)bVar14 * auVar107._24_4_ | (uint)!bVar14 * auVar108._24_4_;
  auVar128._28_4_ =
       (uint)(bVar96 >> 7) * auVar107._28_4_ | (uint)!(bool)(bVar96 >> 7) * auVar108._28_4_;
  auVar185 = ZEXT3264(auVar128);
  bVar96 = (byte)uVar79 & (byte)uVar80 & bVar90;
  auVar107 = vblendmps_avx512vl(auVar183,auVar125);
  auVar129._0_4_ = (uint)(bVar96 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar127._0_4_;
  bVar14 = (bool)(bVar96 >> 1 & 1);
  auVar129._4_4_ = (uint)bVar14 * auVar107._4_4_ | (uint)!bVar14 * auVar127._4_4_;
  bVar14 = (bool)(bVar96 >> 2 & 1);
  auVar129._8_4_ = (uint)bVar14 * auVar107._8_4_ | (uint)!bVar14 * auVar127._8_4_;
  bVar14 = (bool)(bVar96 >> 3 & 1);
  auVar129._12_4_ = (uint)bVar14 * auVar107._12_4_ | (uint)!bVar14 * auVar127._12_4_;
  bVar14 = (bool)(bVar96 >> 4 & 1);
  auVar129._16_4_ = (uint)bVar14 * auVar107._16_4_ | (uint)!bVar14 * auVar127._16_4_;
  bVar14 = (bool)(bVar96 >> 5 & 1);
  auVar129._20_4_ = (uint)bVar14 * auVar107._20_4_ | (uint)!bVar14 * auVar127._20_4_;
  bVar14 = (bool)(bVar96 >> 6 & 1);
  auVar129._24_4_ = (uint)bVar14 * auVar107._24_4_ | (uint)!bVar14 * auVar127._24_4_;
  auVar129._28_4_ =
       (uint)(bVar96 >> 7) * auVar107._28_4_ | (uint)!(bool)(bVar96 >> 7) * auVar127._28_4_;
  auVar186 = ZEXT3264(auVar129);
  auVar166._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
  auVar166._8_4_ = auVar114._8_4_ ^ 0x80000000;
  auVar166._12_4_ = auVar114._12_4_ ^ 0x80000000;
  auVar166._16_4_ = auVar114._16_4_ ^ 0x80000000;
  auVar166._20_4_ = auVar114._20_4_ ^ 0x80000000;
  auVar166._24_4_ = auVar114._24_4_ ^ 0x80000000;
  auVar166._28_4_ = auVar114._28_4_ ^ 0x80000000;
  uVar97 = vcmpps_avx512vl(ZEXT1632(auVar103),auVar87,1);
  uVar97 = (bVar90 & ~(byte)line->rightExists) & uVar97;
  auVar107 = vmulps_avx512vl(auVar117,auVar166);
  bVar14 = (bool)((byte)uVar97 & 1);
  auVar130._0_4_ = (uint)bVar14 * auVar107._0_4_ | (uint)!bVar14 * iVar102;
  bVar14 = (bool)((byte)(uVar97 >> 1) & 1);
  auVar130._4_4_ = (uint)bVar14 * auVar107._4_4_ | (uint)!bVar14 * iVar137;
  bVar14 = (bool)((byte)(uVar97 >> 2) & 1);
  auVar130._8_4_ = (uint)bVar14 * auVar107._8_4_ | (uint)!bVar14 * iVar138;
  bVar14 = (bool)((byte)(uVar97 >> 3) & 1);
  auVar130._12_4_ = (uint)bVar14 * auVar107._12_4_ | (uint)!bVar14 * iVar139;
  bVar14 = (bool)((byte)(uVar97 >> 4) & 1);
  auVar130._16_4_ = (uint)bVar14 * auVar107._16_4_ | (uint)!bVar14 * iVar140;
  bVar14 = (bool)((byte)(uVar97 >> 5) & 1);
  auVar130._20_4_ = (uint)bVar14 * auVar107._20_4_ | (uint)!bVar14 * iVar141;
  bVar14 = (bool)((byte)(uVar97 >> 6) & 1);
  auVar130._24_4_ = (uint)bVar14 * auVar107._24_4_ | (uint)!bVar14 * iVar142;
  bVar14 = SUB81(uVar97 >> 7,0);
  auVar130._28_4_ = (uint)bVar14 * auVar107._28_4_ | (uint)!bVar14 * iVar143;
  auVar107 = vminps_avx512vl(auVar126,auVar130);
  auVar116 = vmaxps_avx512vl(auVar126,auVar130);
  auVar108 = vminps_avx(auVar128,auVar107);
  uVar97 = vcmpps_avx512vl(auVar108,auVar107,0);
  uVar99 = vcmpps_avx512vl(auVar116,auVar119,0);
  bVar14 = (bool)((byte)uVar99 & 1);
  bVar17 = (bool)((byte)(uVar99 >> 1) & 1);
  bVar19 = (bool)((byte)(uVar99 >> 2) & 1);
  bVar21 = (bool)((byte)(uVar99 >> 3) & 1);
  bVar25 = (bool)((byte)(uVar99 >> 4) & 1);
  bVar34 = (bool)((byte)(uVar99 >> 5) & 1);
  bVar43 = (bool)((byte)(uVar99 >> 6) & 1);
  bVar53 = SUB81(uVar99 >> 7,0);
  uVar99 = vcmpps_avx512vl(auVar107,auVar119,0);
  bVar15 = (bool)((byte)uVar99 & 1);
  bVar18 = (bool)((byte)(uVar99 >> 1) & 1);
  bVar20 = (bool)((byte)(uVar99 >> 2) & 1);
  bVar22 = (bool)((byte)(uVar99 >> 3) & 1);
  bVar26 = (bool)((byte)(uVar99 >> 4) & 1);
  bVar35 = (bool)((byte)(uVar99 >> 5) & 1);
  bVar44 = (bool)((byte)(uVar99 >> 6) & 1);
  bVar54 = SUB81(uVar99 >> 7,0);
  bVar16 = (bool)((byte)uVar97 & 1);
  auVar131._0_4_ =
       (uint)bVar16 * ((uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar116._0_4_) |
       (uint)!bVar16 * ((uint)bVar15 * -0x800000 | (uint)!bVar15 * auVar107._0_4_);
  bVar14 = (bool)((byte)(uVar97 >> 1) & 1);
  auVar131._4_4_ =
       (uint)bVar14 * ((uint)bVar17 * -0x800000 | (uint)!bVar17 * auVar116._4_4_) |
       (uint)!bVar14 * ((uint)bVar18 * -0x800000 | (uint)!bVar18 * auVar107._4_4_);
  bVar14 = (bool)((byte)(uVar97 >> 2) & 1);
  auVar131._8_4_ =
       (uint)bVar14 * ((uint)bVar19 * -0x800000 | (uint)!bVar19 * auVar116._8_4_) |
       (uint)!bVar14 * ((uint)bVar20 * -0x800000 | (uint)!bVar20 * auVar107._8_4_);
  bVar14 = (bool)((byte)(uVar97 >> 3) & 1);
  auVar131._12_4_ =
       (uint)bVar14 * ((uint)bVar21 * -0x800000 | (uint)!bVar21 * auVar116._12_4_) |
       (uint)!bVar14 * ((uint)bVar22 * -0x800000 | (uint)!bVar22 * auVar107._12_4_);
  bVar14 = (bool)((byte)(uVar97 >> 4) & 1);
  auVar131._16_4_ =
       (uint)bVar14 * ((uint)bVar25 * -0x800000 | (uint)!bVar25 * auVar116._16_4_) |
       (uint)!bVar14 * ((uint)bVar26 * -0x800000 | (uint)!bVar26 * auVar107._16_4_);
  bVar14 = (bool)((byte)(uVar97 >> 5) & 1);
  auVar131._20_4_ =
       (uint)bVar14 * ((uint)bVar34 * -0x800000 | (uint)!bVar34 * auVar116._20_4_) |
       (uint)!bVar14 * ((uint)bVar35 * -0x800000 | (uint)!bVar35 * auVar107._20_4_);
  bVar14 = (bool)((byte)(uVar97 >> 6) & 1);
  auVar131._24_4_ =
       (uint)bVar14 * ((uint)bVar43 * -0x800000 | (uint)!bVar43 * auVar116._24_4_) |
       (uint)!bVar14 * ((uint)bVar44 * -0x800000 | (uint)!bVar44 * auVar107._24_4_);
  bVar14 = SUB81(uVar97 >> 7,0);
  auVar131._28_4_ =
       (uint)bVar14 * ((uint)bVar53 * -0x800000 | (uint)!bVar53 * auVar116._28_4_) |
       (uint)!bVar14 * ((uint)bVar54 * -0x800000 | (uint)!bVar54 * auVar107._28_4_);
  auVar107 = vmaxps_avx(auVar129,auVar131);
  auVar187 = ZEXT3264(auVar107);
  auVar163._0_4_ = auVar145._0_4_ + auVar108._0_4_;
  auVar163._4_4_ = auVar145._4_4_ + auVar108._4_4_;
  auVar163._8_4_ = auVar145._8_4_ + auVar108._8_4_;
  auVar163._12_4_ = auVar145._12_4_ + auVar108._12_4_;
  auVar163._16_4_ = auVar145._16_4_ + auVar108._16_4_;
  auVar163._20_4_ = auVar145._20_4_ + auVar108._20_4_;
  auVar163._24_4_ = auVar145._24_4_ + auVar108._24_4_;
  auVar163._28_4_ = auVar108._28_4_ + 0.0;
  uVar97 = vcmpps_avx512vl(auVar169,auVar163,2);
  uVar144 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar167._4_4_ = uVar144;
  auVar167._0_4_ = uVar144;
  auVar167._8_4_ = uVar144;
  auVar167._12_4_ = uVar144;
  auVar167._16_4_ = uVar144;
  auVar167._20_4_ = uVar144;
  auVar167._24_4_ = uVar144;
  auVar167._28_4_ = uVar144;
  uVar99 = vcmpps_avx512vl(auVar163,auVar167,2);
  auVar173._0_4_ = auVar107._0_4_ + auVar145._0_4_;
  auVar173._4_4_ = auVar107._4_4_ + auVar145._4_4_;
  auVar173._8_4_ = auVar107._8_4_ + auVar145._8_4_;
  auVar173._12_4_ = auVar107._12_4_ + auVar145._12_4_;
  auVar173._16_4_ = auVar107._16_4_ + auVar145._16_4_;
  auVar173._20_4_ = auVar107._20_4_ + auVar145._20_4_;
  auVar173._24_4_ = auVar107._24_4_ + auVar145._24_4_;
  auVar173._28_4_ = auVar107._28_4_ + 0.0;
  auVar174 = ZEXT3264(auVar173);
  uVar77 = vcmpps_avx512vl(auVar169,auVar173,2);
  uVar78 = vcmpps_avx512vl(auVar173,auVar167,2);
  uVar79 = vcmpps_avx512vl(auVar107,auVar183,4);
  bVar95 = (byte)uVar77 & (byte)uVar78 & (byte)uVar79;
  uVar100 = vcmpps_avx512vl(auVar108,auVar119,4);
  uVar100 = uVar97 & uVar99 & uVar100;
  bVar96 = (byte)uVar100 & bVar90;
  bVar89 = bVar90 & ((byte)uVar100 | bVar95);
  uVar97 = (ulong)bVar89;
  if (bVar89 == 0) {
    return;
  }
  auVar107 = vblendmps_avx512vl(auVar107,auVar108);
  auVar132._0_4_ =
       (float)((uint)(bVar96 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar96 & 1) * (int)auVar163._0_4_
              );
  bVar14 = (bool)(bVar96 >> 1 & 1);
  auVar132._4_4_ = (float)((uint)bVar14 * auVar107._4_4_ | (uint)!bVar14 * (int)auVar163._4_4_);
  bVar14 = (bool)(bVar96 >> 2 & 1);
  auVar132._8_4_ = (float)((uint)bVar14 * auVar107._8_4_ | (uint)!bVar14 * (int)auVar163._8_4_);
  bVar14 = (bool)(bVar96 >> 3 & 1);
  auVar132._12_4_ = (float)((uint)bVar14 * auVar107._12_4_ | (uint)!bVar14 * (int)auVar163._12_4_);
  bVar14 = (bool)(bVar96 >> 4 & 1);
  auVar132._16_4_ = (float)((uint)bVar14 * auVar107._16_4_ | (uint)!bVar14 * (int)auVar163._16_4_);
  bVar14 = (bool)(bVar96 >> 5 & 1);
  auVar132._20_4_ = (float)((uint)bVar14 * auVar107._20_4_ | (uint)!bVar14 * (int)auVar163._20_4_);
  bVar14 = (bool)(bVar96 >> 6 & 1);
  auVar132._24_4_ = (float)((uint)bVar14 * auVar107._24_4_ | (uint)!bVar14 * (int)auVar163._24_4_);
  auVar132._28_4_ =
       (float)((uint)(bVar96 >> 7) * auVar107._28_4_ |
              (uint)!(bool)(bVar96 >> 7) * (int)auVar163._28_4_);
  auVar107 = vblendmps_avx512vl(auVar120,auVar181);
  auVar133._0_4_ =
       (float)((uint)(bVar96 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar96 & 1) * (int)auVar108._0_4_
              );
  bVar14 = (bool)(bVar96 >> 1 & 1);
  auVar133._4_4_ = (float)((uint)bVar14 * auVar107._4_4_ | (uint)!bVar14 * (int)auVar108._4_4_);
  bVar14 = (bool)(bVar96 >> 2 & 1);
  auVar133._8_4_ = (float)((uint)bVar14 * auVar107._8_4_ | (uint)!bVar14 * (int)auVar108._8_4_);
  bVar14 = (bool)(bVar96 >> 3 & 1);
  auVar133._12_4_ = (float)((uint)bVar14 * auVar107._12_4_ | (uint)!bVar14 * (int)auVar108._12_4_);
  bVar14 = (bool)(bVar96 >> 4 & 1);
  auVar133._16_4_ = (float)((uint)bVar14 * auVar107._16_4_ | (uint)!bVar14 * (int)auVar108._16_4_);
  bVar14 = (bool)(bVar96 >> 5 & 1);
  auVar133._20_4_ = (float)((uint)bVar14 * auVar107._20_4_ | (uint)!bVar14 * (int)auVar108._20_4_);
  bVar14 = (bool)(bVar96 >> 6 & 1);
  auVar133._24_4_ = (float)((uint)bVar14 * auVar107._24_4_ | (uint)!bVar14 * (int)auVar108._24_4_);
  auVar133._28_4_ =
       (uint)(bVar96 >> 7) * auVar107._28_4_ | (uint)!(bool)(bVar96 >> 7) * (int)auVar108._28_4_;
  auVar107 = vrcp14ps_avx512vl(auVar113);
  auVar108 = vfnmadd213ps_avx512vl(auVar107,auVar113,auVar122);
  auVar103 = vfmadd132ps_fma(auVar108,auVar107,auVar107);
  auVar182 = ZEXT1664(auVar103);
  auVar88._4_4_ = fVar61 * fVar3 * auVar113._4_4_;
  auVar88._0_4_ = fVar59 * fVar1 * auVar113._0_4_;
  auVar88._8_4_ = fVar64 * fVar62 * auVar113._8_4_;
  auVar88._12_4_ = fVar67 * fVar65 * auVar113._12_4_;
  auVar88._16_4_ = fVar70 * fVar68 * auVar113._16_4_;
  auVar88._20_4_ = fVar73 * fVar71 * auVar113._20_4_;
  auVar88._24_4_ = fVar76 * fVar74 * auVar113._24_4_;
  auVar88._28_4_ = auVar134._28_4_;
  _local_80 = vmulps_avx512vl(auVar109,auVar88);
  auVar108 = vmulps_avx512vl(auVar110,auVar88);
  auVar188 = ZEXT3264(auVar108);
  auVar116 = vmulps_avx512vl(auVar109,auVar149);
  auVar189 = ZEXT3264(auVar116);
  auVar134 = vmulps_avx512vl(auVar110,auVar149);
  auVar190 = ZEXT3264(auVar134);
  uVar77 = vcmpps_avx512vl(auVar132,auVar128,0);
  uVar78 = vcmpps_avx512vl(auVar132,auVar129,0);
  bVar81 = ((byte)uVar77 | (byte)uVar78) & bVar90;
  uVar99 = vcmpps_avx512vl(auVar132,auVar126,0);
  uVar99 = uVar98 & uVar101 & uVar99;
  auVar113 = vmulps_avx512vl(auVar104,auVar132);
  auVar152._0_4_ = auVar113._0_4_ + (float)local_580._0_4_;
  auVar152._4_4_ = auVar113._4_4_ + (float)local_580._4_4_;
  auVar152._8_4_ = auVar113._8_4_ + fStack_578;
  auVar152._12_4_ = auVar113._12_4_ + fStack_574;
  auVar152._16_4_ = auVar113._16_4_ + fStack_570;
  auVar152._20_4_ = auVar113._20_4_ + fStack_56c;
  auVar152._24_4_ = auVar113._24_4_ + fStack_568;
  auVar152._28_4_ = auVar113._28_4_ + local_580._28_4_;
  auVar113 = vmulps_avx512vl(auVar118,auVar152);
  auVar153._0_4_ = local_80._0_4_ + auVar113._0_4_;
  auVar153._4_4_ = local_80._4_4_ + auVar113._4_4_;
  auVar153._8_4_ = local_80._8_4_ + auVar113._8_4_;
  auVar153._12_4_ = local_80._12_4_ + auVar113._12_4_;
  auVar153._16_4_ = local_80._16_4_ + auVar113._16_4_;
  auVar153._20_4_ = local_80._20_4_ + auVar113._20_4_;
  auVar153._24_4_ = local_80._24_4_ + auVar113._24_4_;
  auVar153._28_4_ = local_80._28_4_ + auVar113._28_4_;
  auVar116 = vmulps_avx512vl(auVar116,auVar133);
  auVar113 = vxorps_avx512vl(auVar109,auVar156);
  auVar200 = ZEXT3264(auVar113);
  auVar109 = vblendmps_avx512vl(auVar109,auVar113);
  bVar96 = (byte)uVar99;
  bVar14 = (bool)((byte)(uVar99 >> 1) & 1);
  bVar17 = (bool)((byte)(uVar99 >> 2) & 1);
  bVar20 = (bool)((byte)(uVar99 >> 3) & 1);
  bVar25 = (bool)((byte)(uVar99 >> 4) & 1);
  bVar35 = (bool)((byte)(uVar99 >> 5) & 1);
  bVar53 = (bool)((byte)(uVar99 >> 6) & 1);
  bVar55 = SUB81(uVar99 >> 7,0);
  auVar116 = vsubps_avx512vl(auVar153,auVar116);
  bVar15 = (bool)(bVar81 >> 1 & 1);
  bVar18 = (bool)(bVar81 >> 2 & 1);
  bVar21 = (bool)(bVar81 >> 3 & 1);
  bVar26 = (bool)(bVar81 >> 4 & 1);
  bVar43 = (bool)(bVar81 >> 5 & 1);
  bVar54 = (bool)(bVar81 >> 6 & 1);
  auVar113 = vmulps_avx512vl(auVar105,auVar132);
  auVar112 = vaddps_avx512vl(auVar112,auVar113);
  auVar112 = vmulps_avx512vl(auVar118,auVar112);
  auVar108 = vaddps_avx512vl(auVar108,auVar112);
  iVar137 = (uint)!(bool)(bVar96 & 1) * auVar122._0_4_;
  iVar102 = (uint)!(bool)((byte)(uVar99 >> 1) & 1) * auVar122._4_4_;
  iVar138 = (uint)!(bool)((byte)(uVar99 >> 2) & 1) * auVar122._8_4_;
  iVar139 = (uint)!(bool)((byte)(uVar99 >> 3) & 1) * auVar122._12_4_;
  iVar140 = (uint)!(bool)((byte)(uVar99 >> 4) & 1) * auVar122._16_4_;
  iVar141 = (uint)!(bool)((byte)(uVar99 >> 5) & 1) * auVar122._20_4_;
  iVar142 = (uint)!(bool)((byte)(uVar99 >> 6) & 1) * auVar122._24_4_;
  iVar143 = (uint)!SUB81(uVar99 >> 7,0) * auVar122._28_4_;
  auVar191 = ZEXT3264(CONCAT428(iVar143,CONCAT424(iVar142,CONCAT420(iVar141,CONCAT416(iVar140,
                                                  CONCAT412(iVar139,CONCAT48(iVar138,CONCAT44(
                                                  iVar102,iVar137))))))));
  auVar112 = vmulps_avx512vl(auVar133,ZEXT1632(auVar103));
  bVar16 = (bool)(bVar81 >> 1 & 1);
  bVar19 = (bool)(bVar81 >> 2 & 1);
  bVar22 = (bool)(bVar81 >> 3 & 1);
  bVar34 = (bool)(bVar81 >> 4 & 1);
  bVar44 = (bool)(bVar81 >> 5 & 1);
  bVar45 = (bool)(bVar81 >> 6 & 1);
  local_500[0] = (uint)(bVar81 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar81 & 1) * iVar137;
  local_500[1] = (uint)bVar16 * auVar112._4_4_ | (uint)!bVar16 * iVar102;
  local_500[2] = (uint)bVar19 * auVar112._8_4_ | (uint)!bVar19 * iVar138;
  local_500[3] = (uint)bVar22 * auVar112._12_4_ | (uint)!bVar22 * iVar139;
  uStack_4f0 = (uint)bVar34 * auVar112._16_4_ | (uint)!bVar34 * iVar140;
  uStack_4ec = (uint)bVar44 * auVar112._20_4_ | (uint)!bVar44 * iVar141;
  uStack_4e8 = (uint)bVar45 * auVar112._24_4_ | (uint)!bVar45 * iVar142;
  uStack_4e4 = (uint)(bVar81 >> 7) * auVar112._28_4_ | (uint)!(bool)(bVar81 >> 7) * iVar143;
  auVar134 = vmulps_avx512vl(auVar134,auVar133);
  local_4e0 = ZEXT432(0) << 0x20;
  auVar112 = vxorps_avx512vl(auVar110,auVar156);
  auVar170 = ZEXT3264(auVar112);
  local_4c0._0_4_ = auVar145._0_4_ + auVar132._0_4_;
  local_4c0._4_4_ = auVar145._4_4_ + auVar132._4_4_;
  local_4c0._8_4_ = auVar145._8_4_ + auVar132._8_4_;
  local_4c0._12_4_ = auVar145._12_4_ + auVar132._12_4_;
  local_4c0._16_4_ = auVar145._16_4_ + auVar132._16_4_;
  local_4c0._20_4_ = auVar145._20_4_ + auVar132._20_4_;
  local_4c0._24_4_ = auVar145._24_4_ + auVar132._24_4_;
  local_4c0._28_4_ = auVar132._28_4_ + 0.0;
  local_4a0[0] = (uint)(bVar81 & 1) * auVar116._0_4_ |
                 (uint)!(bool)(bVar81 & 1) *
                 ((uint)(bVar96 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar107._0_4_);
  local_4a0[1] = (uint)bVar15 * auVar116._4_4_ |
                 (uint)!bVar15 * ((uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * auVar107._4_4_);
  local_4a0[2] = (uint)bVar18 * auVar116._8_4_ |
                 (uint)!bVar18 * ((uint)bVar17 * auVar109._8_4_ | (uint)!bVar17 * auVar107._8_4_);
  local_4a0[3] = (uint)bVar21 * auVar116._12_4_ |
                 (uint)!bVar21 * ((uint)bVar20 * auVar109._12_4_ | (uint)!bVar20 * auVar107._12_4_);
  uStack_490 = (uint)bVar26 * auVar116._16_4_ |
               (uint)!bVar26 * ((uint)bVar25 * auVar109._16_4_ | (uint)!bVar25 * auVar107._16_4_);
  uStack_48c = (uint)bVar43 * auVar116._20_4_ |
               (uint)!bVar43 * ((uint)bVar35 * auVar109._20_4_ | (uint)!bVar35 * auVar107._20_4_);
  uStack_488 = (uint)bVar54 * auVar116._24_4_ |
               (uint)!bVar54 * ((uint)bVar53 * auVar109._24_4_ | (uint)!bVar53 * auVar107._24_4_);
  uStack_484 = (uint)(bVar81 >> 7) * auVar116._28_4_ |
               (uint)!(bool)(bVar81 >> 7) *
               ((uint)bVar55 * auVar109._28_4_ | (uint)!bVar55 * auVar107._28_4_);
  auVar107 = vblendmps_avx512vl(auVar110,auVar112);
  bVar14 = (bool)((byte)(uVar99 >> 1) & 1);
  bVar16 = (bool)((byte)(uVar99 >> 2) & 1);
  bVar17 = (bool)((byte)(uVar99 >> 3) & 1);
  bVar18 = (bool)((byte)(uVar99 >> 4) & 1);
  bVar19 = (bool)((byte)(uVar99 >> 5) & 1);
  bVar20 = (bool)((byte)(uVar99 >> 6) & 1);
  auVar108 = vsubps_avx512vl(auVar108,auVar134);
  local_480[0] = (uint)(bVar81 & 1) * auVar108._0_4_ |
                 (uint)!(bool)(bVar81 & 1) *
                 ((uint)(bVar96 & 1) * auVar107._0_4_ |
                 (uint)!(bool)(bVar96 & 1) * (int)auVar145._0_4_);
  bVar15 = (bool)(bVar81 >> 1 & 1);
  local_480[1] = (uint)bVar15 * auVar108._4_4_ |
                 (uint)!bVar15 *
                 ((uint)bVar14 * auVar107._4_4_ | (uint)!bVar14 * (int)auVar145._4_4_);
  bVar14 = (bool)(bVar81 >> 2 & 1);
  local_480[2] = (uint)bVar14 * auVar108._8_4_ |
                 (uint)!bVar14 *
                 ((uint)bVar16 * auVar107._8_4_ | (uint)!bVar16 * (int)auVar145._8_4_);
  bVar14 = (bool)(bVar81 >> 3 & 1);
  local_480[3] = (uint)bVar14 * auVar108._12_4_ |
                 (uint)!bVar14 *
                 ((uint)bVar17 * auVar107._12_4_ | (uint)!bVar17 * (int)auVar145._12_4_);
  bVar14 = (bool)(bVar81 >> 4 & 1);
  uStack_470 = (uint)bVar14 * auVar108._16_4_ |
               (uint)!bVar14 *
               ((uint)bVar18 * auVar107._16_4_ | (uint)!bVar18 * (int)auVar145._16_4_);
  bVar14 = (bool)(bVar81 >> 5 & 1);
  uStack_46c = (uint)bVar14 * auVar108._20_4_ |
               (uint)!bVar14 *
               ((uint)bVar19 * auVar107._20_4_ | (uint)!bVar19 * (int)auVar145._20_4_);
  bVar14 = (bool)(bVar81 >> 6 & 1);
  uStack_468 = (uint)bVar14 * auVar108._24_4_ |
               (uint)!bVar14 *
               ((uint)bVar20 * auVar107._24_4_ | (uint)!bVar20 * (int)auVar145._24_4_);
  uStack_464 = (uint)(bVar81 >> 7) * auVar108._28_4_ |
               (uint)!(bool)(bVar81 >> 7) * (uint)(byte)(uVar99 >> 7) * auVar107._28_4_;
  _local_c0 = vmulps_avx512vl(auVar111,auVar88);
  auVar107 = vmulps_avx512vl(auVar111,auVar149);
  auVar161 = ZEXT3264(auVar107);
  auVar108 = vmulps_avx512vl(auVar106,auVar132);
  auVar106._0_4_ = auVar108._0_4_ + (float)local_540._0_4_;
  auVar106._4_4_ = auVar108._4_4_ + (float)local_540._4_4_;
  auVar106._8_4_ = auVar108._8_4_ + fStack_538;
  auVar106._12_4_ = auVar108._12_4_ + fStack_534;
  auVar106._16_4_ = auVar108._16_4_ + fStack_530;
  auVar106._20_4_ = auVar108._20_4_ + fStack_52c;
  auVar106._24_4_ = auVar108._24_4_ + fStack_528;
  auVar106._28_4_ = auVar108._28_4_ + fStack_524;
  auVar108 = vmulps_avx512vl(auVar118,auVar106);
  auVar148._0_4_ = local_c0._0_4_ + auVar108._0_4_;
  auVar148._4_4_ = local_c0._4_4_ + auVar108._4_4_;
  auVar148._8_4_ = local_c0._8_4_ + auVar108._8_4_;
  auVar148._12_4_ = local_c0._12_4_ + auVar108._12_4_;
  auVar148._16_4_ = local_c0._16_4_ + auVar108._16_4_;
  auVar148._20_4_ = local_c0._20_4_ + auVar108._20_4_;
  auVar148._24_4_ = local_c0._24_4_ + auVar108._24_4_;
  auVar148._28_4_ = local_c0._28_4_ + auVar108._28_4_;
  auVar104._4_4_ = auVar107._4_4_ * auVar133._4_4_;
  auVar104._0_4_ = auVar107._0_4_ * auVar133._0_4_;
  auVar104._8_4_ = auVar107._8_4_ * auVar133._8_4_;
  auVar104._12_4_ = auVar107._12_4_ * auVar133._12_4_;
  auVar104._16_4_ = auVar107._16_4_ * auVar133._16_4_;
  auVar104._20_4_ = auVar107._20_4_ * auVar133._20_4_;
  auVar104._24_4_ = auVar107._24_4_ * auVar133._24_4_;
  auVar104._28_4_ = auVar149._28_4_;
  local_a0 = vxorps_avx512vl(auVar111,auVar156);
  auVar107 = vblendmps_avx512vl(auVar111,local_a0);
  bVar14 = (bool)((byte)(uVar99 >> 1) & 1);
  bVar16 = (bool)((byte)(uVar99 >> 2) & 1);
  bVar17 = (bool)((byte)(uVar99 >> 3) & 1);
  bVar18 = (bool)((byte)(uVar99 >> 4) & 1);
  bVar19 = (bool)((byte)(uVar99 >> 5) & 1);
  bVar20 = (bool)((byte)(uVar99 >> 6) & 1);
  bVar21 = SUB81(uVar99 >> 7,0);
  auVar154 = ZEXT3264(local_4c0);
  auVar108 = vsubps_avx512vl(auVar148,auVar104);
  local_460[0] = (uint)(bVar81 & 1) * auVar108._0_4_ |
                 (uint)!(bool)(bVar81 & 1) *
                 ((uint)(bVar96 & 1) * auVar107._0_4_ | !(bool)(bVar96 & 1) * local_480[0]);
  bVar15 = (bool)(bVar81 >> 1 & 1);
  local_460[1] = (uint)bVar15 * auVar108._4_4_ |
                 (uint)!bVar15 * ((uint)bVar14 * auVar107._4_4_ | !bVar14 * local_480[1]);
  bVar14 = (bool)(bVar81 >> 2 & 1);
  local_460[2] = (uint)bVar14 * auVar108._8_4_ |
                 (uint)!bVar14 * ((uint)bVar16 * auVar107._8_4_ | !bVar16 * local_480[2]);
  bVar14 = (bool)(bVar81 >> 3 & 1);
  local_460[3] = (uint)bVar14 * auVar108._12_4_ |
                 (uint)!bVar14 * ((uint)bVar17 * auVar107._12_4_ | !bVar17 * local_480[3]);
  bVar14 = (bool)(bVar81 >> 4 & 1);
  uStack_450 = (uint)bVar14 * auVar108._16_4_ |
               (uint)!bVar14 * ((uint)bVar18 * auVar107._16_4_ | !bVar18 * uStack_470);
  bVar14 = (bool)(bVar81 >> 5 & 1);
  uStack_44c = (uint)bVar14 * auVar108._20_4_ |
               (uint)!bVar14 * ((uint)bVar19 * auVar107._20_4_ | !bVar19 * uStack_46c);
  bVar14 = (bool)(bVar81 >> 6 & 1);
  uStack_448 = (uint)bVar14 * auVar108._24_4_ |
               (uint)!bVar14 * ((uint)bVar20 * auVar107._24_4_ | !bVar20 * uStack_468);
  uStack_444 = (uint)(bVar81 >> 7) * auVar108._28_4_ |
               (uint)!(bool)(bVar81 >> 7) * ((uint)bVar21 * auVar107._28_4_ | !bVar21 * uStack_464);
  auVar107 = vblendmps_avx512vl(auVar119,local_4c0);
  auVar105._0_4_ = (uint)(bVar89 & 1) * auVar107._0_4_ | !(bool)(bVar89 & 1) * local_460[0];
  bVar14 = (bool)(bVar89 >> 1 & 1);
  auVar105._4_4_ = (uint)bVar14 * auVar107._4_4_ | !bVar14 * local_460[1];
  bVar14 = (bool)(bVar89 >> 2 & 1);
  auVar105._8_4_ = (uint)bVar14 * auVar107._8_4_ | !bVar14 * local_460[2];
  bVar14 = (bool)(bVar89 >> 3 & 1);
  auVar105._12_4_ = (uint)bVar14 * auVar107._12_4_ | !bVar14 * local_460[3];
  bVar14 = (bool)(bVar89 >> 4 & 1);
  auVar105._16_4_ = (uint)bVar14 * auVar107._16_4_ | !bVar14 * uStack_450;
  bVar14 = (bool)(bVar89 >> 5 & 1);
  auVar105._20_4_ = (uint)bVar14 * auVar107._20_4_ | !bVar14 * uStack_44c;
  bVar14 = (bool)(bVar89 >> 6 & 1);
  auVar105._24_4_ = (uint)bVar14 * auVar107._24_4_ | !bVar14 * uStack_448;
  auVar105._28_4_ = (uint)(bVar89 >> 7) * auVar107._28_4_ | !(bool)(bVar89 >> 7) * uStack_444;
  auVar107 = vshufps_avx(auVar105,auVar105,0xb1);
  auVar107 = vminps_avx(auVar105,auVar107);
  auVar108 = vshufpd_avx(auVar107,auVar107,5);
  auVar107 = vminps_avx(auVar107,auVar108);
  auVar108 = vpermpd_avx2(auVar107,0x4e);
  auVar107 = vminps_avx(auVar107,auVar108);
  uVar77 = vcmpps_avx512vl(auVar105,auVar107,0);
  if (((byte)uVar77 & bVar89) != 0) {
    bVar89 = (byte)uVar77 & bVar89;
  }
  uVar91 = 0;
  for (uVar92 = (uint)bVar89; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
    uVar91 = uVar91 + 1;
  }
  auVar103 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar164 = ZEXT1664(auVar103);
  auVar107 = vpcmpeqd_avx2(local_4c0,local_4c0);
  auVar184 = ZEXT3264(auVar107);
  auVar168 = ZEXT3264(auVar120);
  local_548 = context;
  do {
    bVar96 = (byte)uVar100;
    auVar159 = auVar161._0_28_;
    local_5c0.hit = local_440;
    local_5c0.valid = (int *)local_5e0;
    auVar160 = auVar191._0_32_;
    auVar109 = auVar182._0_32_;
    auVar115 = auVar199._0_32_;
    auVar114 = auVar198._0_32_;
    auVar108 = auVar170._0_32_;
    auVar117 = auVar200._0_32_;
    auVar111 = auVar197._0_32_;
    auVar158 = auVar157._28_36_;
    auVar155 = auVar190._0_32_;
    auVar127 = auVar189._0_32_;
    auVar107 = auVar168._0_32_;
    auVar113 = auVar188._0_32_;
    auVar119 = auVar202._0_32_;
    auVar118 = auVar201._0_32_;
    auVar110 = auVar196._0_32_;
    auVar106 = auVar195._0_32_;
    auVar104 = auVar194._0_32_;
    auVar162 = auVar192._0_32_;
    auVar134 = auVar186._0_32_;
    auVar112 = auVar187._0_32_;
    auVar116 = auVar185._0_32_;
    uVar94 = uVar91 & 0xff;
    uVar92 = *(uint *)(local_e0 + (ulong)uVar94 * 4);
    pGVar11 = (pSVar10->geometries).items[uVar92].ptr;
    local_5c0.ray = (RTCRayN *)ray;
    if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
      uVar97 = (ulong)(byte)(~(byte)(1 << (uVar91 & 0x1f)) & (byte)uVar97);
    }
    else {
      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
         (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
        uVar101 = (ulong)(uVar94 << 2);
        uVar144 = *(undefined4 *)((long)local_500 + uVar101);
        uVar4 = *(undefined4 *)(local_4e0 + uVar101);
        uVar91 = *(uint *)(local_4c0 + uVar101);
        *(uint *)(ray + k * 4 + 0x80) = uVar91;
        *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)local_4a0 + uVar101);
        *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)local_480 + uVar101);
        *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)local_460 + uVar101);
        *(undefined4 *)(ray + k * 4 + 0xf0) = uVar144;
        *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
        *(undefined4 *)(ray + k * 4 + 0x110) =
             *(undefined4 *)((long)&(line->primIDs).field_0 + uVar101);
        *(uint *)(ray + k * 4 + 0x120) = uVar92;
        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
        goto LAB_01981bd0;
      }
      local_120 = auVar154._0_32_;
      local_100 = auVar161._0_32_;
      uVar101 = (ulong)(uVar94 * 4);
      local_410 = *(undefined4 *)((long)local_500 + uVar101);
      local_400 = *(undefined4 *)(local_4e0 + uVar101);
      local_3e0 = vpbroadcastd_avx512vl();
      local_3f0._4_4_ = *(undefined4 *)((long)&(line->primIDs).field_0 + uVar101);
      uVar144 = *(undefined4 *)((long)local_4a0 + uVar101);
      uVar4 = *(undefined4 *)((long)local_480 + uVar101);
      local_430._4_4_ = uVar4;
      local_430._0_4_ = uVar4;
      local_430._8_4_ = uVar4;
      local_430._12_4_ = uVar4;
      auVar157 = ZEXT1664(local_430);
      local_420._4_4_ = *(undefined4 *)((long)local_460 + uVar101);
      local_440[0] = (RTCHitN)(char)uVar144;
      local_440[1] = (RTCHitN)(char)((uint)uVar144 >> 8);
      local_440[2] = (RTCHitN)(char)((uint)uVar144 >> 0x10);
      local_440[3] = (RTCHitN)(char)((uint)uVar144 >> 0x18);
      local_440[4] = (RTCHitN)(char)uVar144;
      local_440[5] = (RTCHitN)(char)((uint)uVar144 >> 8);
      local_440[6] = (RTCHitN)(char)((uint)uVar144 >> 0x10);
      local_440[7] = (RTCHitN)(char)((uint)uVar144 >> 0x18);
      local_440[8] = (RTCHitN)(char)uVar144;
      local_440[9] = (RTCHitN)(char)((uint)uVar144 >> 8);
      local_440[10] = (RTCHitN)(char)((uint)uVar144 >> 0x10);
      local_440[0xb] = (RTCHitN)(char)((uint)uVar144 >> 0x18);
      local_440[0xc] = (RTCHitN)(char)uVar144;
      local_440[0xd] = (RTCHitN)(char)((uint)uVar144 >> 8);
      local_440[0xe] = (RTCHitN)(char)((uint)uVar144 >> 0x10);
      local_440[0xf] = (RTCHitN)(char)((uint)uVar144 >> 0x18);
      local_420._0_4_ = local_420._4_4_;
      local_420._8_4_ = local_420._4_4_;
      local_420._12_4_ = local_420._4_4_;
      uStack_40c = local_410;
      uStack_408 = local_410;
      uStack_404 = local_410;
      uStack_3fc = local_400;
      uStack_3f8 = local_400;
      uStack_3f4 = local_400;
      local_3f0._0_4_ = local_3f0._4_4_;
      local_3f0._8_4_ = local_3f0._4_4_;
      local_3f0._12_4_ = local_3f0._4_4_;
      uStack_3cc = context->user->instID[0];
      local_3d0 = uStack_3cc;
      uStack_3c8 = uStack_3cc;
      uStack_3c4 = uStack_3cc;
      uStack_3c0 = context->user->instPrimID[0];
      uStack_3bc = uStack_3c0;
      uStack_3b8 = uStack_3c0;
      uStack_3b4 = uStack_3c0;
      local_3b0 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_4c0 + uVar101);
      local_5e0 = auVar164._0_16_;
      local_5c0.geometryUserPtr = pGVar11->userPtr;
      local_5c0.context = context->user;
      local_5c0.N = 4;
      local_520 = auVar174._0_32_;
      local_140 = auVar104;
      local_160 = auVar106;
      local_180 = auVar110;
      local_1a0 = auVar111;
      local_1c0 = auVar114;
      local_1e0 = auVar115;
      local_200 = auVar118;
      local_220 = auVar119;
      local_240 = auVar160;
      local_260 = auVar107;
      local_280 = auVar162;
      local_2a0 = auVar116;
      local_2c0 = auVar134;
      local_2e0 = auVar109;
      local_300 = auVar112;
      local_320 = auVar113;
      local_340 = auVar127;
      local_360 = auVar155;
      local_380 = auVar117;
      local_3a0 = auVar108;
      uVar101 = uVar100;
      local_590 = local_5e0;
      if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
        auVar157 = ZEXT1664(local_430);
        auVar107 = ZEXT1632(auVar184._0_16_);
        local_5c8 = line;
        (*pGVar11->intersectionFilterN)(&local_5c0);
        auVar107 = vpcmpeqd_avx2(auVar107,auVar107);
        auVar184 = ZEXT3264(auVar107);
        auVar170 = ZEXT3264(local_3a0);
        auVar200 = ZEXT3264(local_380);
        uVar101 = uVar100 & 0xffff;
        auVar190 = ZEXT3264(local_360);
        auVar189 = ZEXT3264(local_340);
        auVar188 = ZEXT3264(local_320);
        auVar187 = ZEXT3264(local_300);
        auVar182 = ZEXT3264(local_2e0);
        auVar186 = ZEXT3264(local_2c0);
        auVar185 = ZEXT3264(local_2a0);
        auVar192 = ZEXT3264(local_280);
        auVar168 = ZEXT3264(local_260);
        auVar164 = ZEXT1664(local_590);
        auVar191 = ZEXT3264(local_240);
        auVar202 = ZEXT3264(local_220);
        auVar201 = ZEXT3264(local_200);
        auVar199 = ZEXT3264(local_1e0);
        auVar198 = ZEXT3264(local_1c0);
        auVar197 = ZEXT3264(local_1a0);
        auVar196 = ZEXT3264(local_180);
        auVar195 = ZEXT3264(local_160);
        auVar194 = ZEXT3264(local_140);
        auVar174 = ZEXT3264(local_520);
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar193 = ZEXT3264(auVar107);
        line = local_5c8;
      }
      uVar98 = vptestmd_avx512vl(local_5e0,local_5e0);
      auVar161 = ZEXT3264(local_100);
      auVar154 = ZEXT3264(local_120);
      if ((uVar98 & 0xf) == 0) {
LAB_01981aef:
        *(undefined4 *)(ray + k * 4 + 0x80) = local_3b0._0_4_;
        uVar144 = local_3b0._0_4_;
      }
      else {
        p_Var13 = context->args->filter;
        if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
             RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
          auVar157 = ZEXT1664(auVar157._0_16_);
          auVar107 = ZEXT1632(auVar184._0_16_);
          (*p_Var13)(&local_5c0);
          auVar107 = vpcmpeqd_avx2(auVar107,auVar107);
          auVar184 = ZEXT3264(auVar107);
          auVar154 = ZEXT3264(local_120);
          auVar161 = ZEXT3264(local_100);
          auVar170 = ZEXT3264(local_3a0);
          auVar200 = ZEXT3264(local_380);
          uVar101 = uVar100 & 0xffff;
          auVar190 = ZEXT3264(local_360);
          auVar189 = ZEXT3264(local_340);
          auVar188 = ZEXT3264(local_320);
          auVar187 = ZEXT3264(local_300);
          auVar182 = ZEXT3264(local_2e0);
          auVar186 = ZEXT3264(local_2c0);
          auVar185 = ZEXT3264(local_2a0);
          auVar192 = ZEXT3264(local_280);
          auVar168 = ZEXT3264(local_260);
          auVar164 = ZEXT1664(local_590);
          auVar191 = ZEXT3264(local_240);
          auVar202 = ZEXT3264(local_220);
          auVar201 = ZEXT3264(local_200);
          auVar199 = ZEXT3264(local_1e0);
          auVar198 = ZEXT3264(local_1c0);
          auVar197 = ZEXT3264(local_1a0);
          auVar196 = ZEXT3264(local_180);
          auVar195 = ZEXT3264(local_160);
          auVar194 = ZEXT3264(local_140);
          auVar174 = ZEXT3264(local_520);
          auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar193 = ZEXT3264(auVar107);
        }
        uVar98 = vptestmd_avx512vl(local_5e0,local_5e0);
        uVar98 = uVar98 & 0xf;
        bVar96 = (byte)uVar98;
        if (bVar96 == 0) goto LAB_01981aef;
        iVar102 = *(int *)(local_5c0.hit + 4);
        iVar137 = *(int *)(local_5c0.hit + 8);
        iVar138 = *(int *)(local_5c0.hit + 0xc);
        bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar98 >> 2) & 1);
        bVar16 = SUB81(uVar98 >> 3,0);
        *(uint *)(local_5c0.ray + 0xc0) =
             (uint)(bVar96 & 1) * *(int *)local_5c0.hit |
             (uint)!(bool)(bVar96 & 1) * *(int *)(local_5c0.ray + 0xc0);
        *(uint *)(local_5c0.ray + 0xc4) =
             (uint)bVar14 * iVar102 | (uint)!bVar14 * *(int *)(local_5c0.ray + 0xc4);
        *(uint *)(local_5c0.ray + 200) =
             (uint)bVar15 * iVar137 | (uint)!bVar15 * *(int *)(local_5c0.ray + 200);
        *(uint *)(local_5c0.ray + 0xcc) =
             (uint)bVar16 * iVar138 | (uint)!bVar16 * *(int *)(local_5c0.ray + 0xcc);
        iVar102 = *(int *)(local_5c0.hit + 0x14);
        iVar137 = *(int *)(local_5c0.hit + 0x18);
        iVar138 = *(int *)(local_5c0.hit + 0x1c);
        bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar98 >> 2) & 1);
        bVar16 = SUB81(uVar98 >> 3,0);
        *(uint *)(local_5c0.ray + 0xd0) =
             (uint)(bVar96 & 1) * *(int *)(local_5c0.hit + 0x10) |
             (uint)!(bool)(bVar96 & 1) * *(int *)(local_5c0.ray + 0xd0);
        *(uint *)(local_5c0.ray + 0xd4) =
             (uint)bVar14 * iVar102 | (uint)!bVar14 * *(int *)(local_5c0.ray + 0xd4);
        *(uint *)(local_5c0.ray + 0xd8) =
             (uint)bVar15 * iVar137 | (uint)!bVar15 * *(int *)(local_5c0.ray + 0xd8);
        *(uint *)(local_5c0.ray + 0xdc) =
             (uint)bVar16 * iVar138 | (uint)!bVar16 * *(int *)(local_5c0.ray + 0xdc);
        iVar102 = *(int *)(local_5c0.hit + 0x24);
        iVar137 = *(int *)(local_5c0.hit + 0x28);
        iVar138 = *(int *)(local_5c0.hit + 0x2c);
        bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar98 >> 2) & 1);
        bVar16 = SUB81(uVar98 >> 3,0);
        *(uint *)(local_5c0.ray + 0xe0) =
             (uint)(bVar96 & 1) * *(int *)(local_5c0.hit + 0x20) |
             (uint)!(bool)(bVar96 & 1) * *(int *)(local_5c0.ray + 0xe0);
        *(uint *)(local_5c0.ray + 0xe4) =
             (uint)bVar14 * iVar102 | (uint)!bVar14 * *(int *)(local_5c0.ray + 0xe4);
        *(uint *)(local_5c0.ray + 0xe8) =
             (uint)bVar15 * iVar137 | (uint)!bVar15 * *(int *)(local_5c0.ray + 0xe8);
        *(uint *)(local_5c0.ray + 0xec) =
             (uint)bVar16 * iVar138 | (uint)!bVar16 * *(int *)(local_5c0.ray + 0xec);
        iVar102 = *(int *)(local_5c0.hit + 0x34);
        iVar137 = *(int *)(local_5c0.hit + 0x38);
        iVar138 = *(int *)(local_5c0.hit + 0x3c);
        bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar98 >> 2) & 1);
        bVar16 = SUB81(uVar98 >> 3,0);
        *(uint *)(local_5c0.ray + 0xf0) =
             (uint)(bVar96 & 1) * *(int *)(local_5c0.hit + 0x30) |
             (uint)!(bool)(bVar96 & 1) * *(int *)(local_5c0.ray + 0xf0);
        *(uint *)(local_5c0.ray + 0xf4) =
             (uint)bVar14 * iVar102 | (uint)!bVar14 * *(int *)(local_5c0.ray + 0xf4);
        *(uint *)(local_5c0.ray + 0xf8) =
             (uint)bVar15 * iVar137 | (uint)!bVar15 * *(int *)(local_5c0.ray + 0xf8);
        *(uint *)(local_5c0.ray + 0xfc) =
             (uint)bVar16 * iVar138 | (uint)!bVar16 * *(int *)(local_5c0.ray + 0xfc);
        iVar102 = *(int *)(local_5c0.hit + 0x44);
        iVar137 = *(int *)(local_5c0.hit + 0x48);
        iVar138 = *(int *)(local_5c0.hit + 0x4c);
        bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar98 >> 2) & 1);
        bVar16 = SUB81(uVar98 >> 3,0);
        *(uint *)(local_5c0.ray + 0x100) =
             (uint)(bVar96 & 1) * *(int *)(local_5c0.hit + 0x40) |
             (uint)!(bool)(bVar96 & 1) * *(int *)(local_5c0.ray + 0x100);
        *(uint *)(local_5c0.ray + 0x104) =
             (uint)bVar14 * iVar102 | (uint)!bVar14 * *(int *)(local_5c0.ray + 0x104);
        *(uint *)(local_5c0.ray + 0x108) =
             (uint)bVar15 * iVar137 | (uint)!bVar15 * *(int *)(local_5c0.ray + 0x108);
        *(uint *)(local_5c0.ray + 0x10c) =
             (uint)bVar16 * iVar138 | (uint)!bVar16 * *(int *)(local_5c0.ray + 0x10c);
        auVar103 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_5c0.hit + 0x50));
        *(undefined1 (*) [16])(local_5c0.ray + 0x110) = auVar103;
        auVar103 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_5c0.hit + 0x60));
        *(undefined1 (*) [16])(local_5c0.ray + 0x120) = auVar103;
        auVar103 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_5c0.hit + 0x70));
        *(undefined1 (*) [16])(local_5c0.ray + 0x130) = auVar103;
        auVar103 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_5c0.hit + 0x80));
        *(undefined1 (*) [16])(local_5c0.ray + 0x140) = auVar103;
        uVar144 = *(undefined4 *)(ray + k * 4 + 0x80);
      }
      auVar105._4_4_ = uVar144;
      auVar105._0_4_ = uVar144;
      auVar105._8_4_ = uVar144;
      auVar105._12_4_ = uVar144;
      auVar105._16_4_ = uVar144;
      auVar105._20_4_ = uVar144;
      auVar105._24_4_ = uVar144;
      auVar105._28_4_ = uVar144;
      uVar98 = vcmpps_avx512vl(auVar154._0_32_,auVar105,2);
      uVar97 = (byte)(~(byte)(1 << (uVar91 & 0x1f)) & (byte)uVar97) & uVar98;
      uVar100 = uVar101;
    }
    bVar96 = (byte)uVar100;
    auVar159 = auVar161._0_28_;
    auVar160 = auVar191._0_32_;
    auVar109 = auVar182._0_32_;
    auVar115 = auVar199._0_32_;
    auVar114 = auVar198._0_32_;
    auVar108 = auVar170._0_32_;
    auVar117 = auVar200._0_32_;
    auVar111 = auVar197._0_32_;
    auVar158 = auVar157._28_36_;
    auVar155 = auVar190._0_32_;
    auVar127 = auVar189._0_32_;
    auVar107 = auVar168._0_32_;
    auVar113 = auVar188._0_32_;
    auVar119 = auVar202._0_32_;
    auVar118 = auVar201._0_32_;
    auVar110 = auVar196._0_32_;
    auVar106 = auVar195._0_32_;
    auVar104 = auVar194._0_32_;
    auVar162 = auVar192._0_32_;
    auVar134 = auVar186._0_32_;
    auVar112 = auVar187._0_32_;
    auVar116 = auVar185._0_32_;
    bVar89 = (byte)uVar97;
    if (bVar89 == 0) break;
    auVar107 = vblendmps_avx512vl(auVar193._0_32_,auVar154._0_32_);
    auVar135._0_4_ =
         (uint)(bVar89 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar89 & 1) * auVar105._0_4_;
    bVar14 = (bool)((byte)(uVar97 >> 1) & 1);
    auVar135._4_4_ = (uint)bVar14 * auVar107._4_4_ | (uint)!bVar14 * auVar105._4_4_;
    bVar14 = (bool)((byte)(uVar97 >> 2) & 1);
    auVar135._8_4_ = (uint)bVar14 * auVar107._8_4_ | (uint)!bVar14 * auVar105._8_4_;
    bVar14 = (bool)((byte)(uVar97 >> 3) & 1);
    auVar135._12_4_ = (uint)bVar14 * auVar107._12_4_ | (uint)!bVar14 * auVar105._12_4_;
    bVar14 = (bool)((byte)(uVar97 >> 4) & 1);
    auVar135._16_4_ = (uint)bVar14 * auVar107._16_4_ | (uint)!bVar14 * auVar105._16_4_;
    bVar14 = (bool)((byte)(uVar97 >> 5) & 1);
    auVar135._20_4_ = (uint)bVar14 * auVar107._20_4_ | (uint)!bVar14 * auVar105._20_4_;
    bVar14 = (bool)((byte)(uVar97 >> 6) & 1);
    auVar135._24_4_ = (uint)bVar14 * auVar107._24_4_ | (uint)!bVar14 * auVar105._24_4_;
    bVar14 = SUB81(uVar97 >> 7,0);
    auVar135._28_4_ = (uint)bVar14 * auVar107._28_4_ | (uint)!bVar14 * auVar105._28_4_;
    auVar107 = vshufps_avx(auVar135,auVar135,0xb1);
    auVar107 = vminps_avx(auVar135,auVar107);
    auVar108 = vshufpd_avx(auVar107,auVar107,5);
    auVar107 = vminps_avx(auVar107,auVar108);
    auVar108 = vpermpd_avx2(auVar107,0x4e);
    auVar107 = vminps_avx(auVar107,auVar108);
    uVar77 = vcmpps_avx512vl(auVar135,auVar107,0);
    bVar89 = (byte)uVar77 & bVar89;
    uVar92 = (uint)uVar97;
    if (bVar89 != 0) {
      uVar92 = (uint)bVar89;
    }
    uVar91 = 0;
    for (; auVar105 = auVar135, (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
      uVar91 = uVar91 + 1;
    }
  } while( true );
  uVar91 = *(uint *)(ray + k * 4 + 0x80);
LAB_01981bd0:
  auVar194 = ZEXT464(uVar91);
  auVar105 = vbroadcastss_avx512vl(ZEXT416(uVar91));
  local_4c0 = auVar174._0_32_;
  uVar77 = vcmpps_avx512vl(local_4c0,auVar105,2);
  bVar90 = bVar96 & (byte)uVar77 & bVar95 & bVar90;
  uVar101 = (ulong)bVar90;
  if (bVar90 == 0) {
    return;
  }
  uVar77 = vcmpps_avx512vl(auVar112,auVar116,0);
  uVar78 = vcmpps_avx512vl(auVar112,auVar134,0);
  bVar89 = (byte)uVar77 | (byte)uVar78;
  uVar98 = vcmpps_avx512vl(auVar112,auVar162,0);
  auVar116 = vmulps_avx512vl(auVar104,auVar112);
  auVar134 = vmulps_avx512vl(auVar106,auVar112);
  auVar112 = vmulps_avx512vl(auVar110,auVar112);
  auVar146._0_4_ = auVar116._0_4_ + (float)local_580._0_4_;
  auVar146._4_4_ = auVar116._4_4_ + (float)local_580._4_4_;
  auVar146._8_4_ = auVar116._8_4_ + fStack_578;
  auVar146._12_4_ = auVar116._12_4_ + fStack_574;
  auVar146._16_4_ = auVar116._16_4_ + fStack_570;
  auVar146._20_4_ = auVar116._20_4_ + fStack_56c;
  auVar146._24_4_ = auVar116._24_4_ + fStack_568;
  auVar146._28_4_ = auVar116._28_4_ + fStack_564;
  auVar116 = vaddps_avx512vl(auVar118,auVar134);
  auVar150._0_4_ = auVar112._0_4_ + (float)local_540._0_4_;
  auVar150._4_4_ = auVar112._4_4_ + (float)local_540._4_4_;
  auVar150._8_4_ = auVar112._8_4_ + fStack_538;
  auVar150._12_4_ = auVar112._12_4_ + fStack_534;
  auVar150._16_4_ = auVar112._16_4_ + fStack_530;
  auVar150._20_4_ = auVar112._20_4_ + fStack_52c;
  auVar150._24_4_ = auVar112._24_4_ + fStack_528;
  auVar150._28_4_ = auVar112._28_4_ + fStack_524;
  auVar134 = vmulps_avx512vl(auVar119,auVar146);
  auVar116 = vmulps_avx512vl(auVar119,auVar116);
  auVar112 = vmulps_avx512vl(auVar119,auVar150);
  auVar147._0_4_ = auVar134._0_4_ + (float)local_80._0_4_;
  auVar147._4_4_ = auVar134._4_4_ + (float)local_80._4_4_;
  auVar147._8_4_ = auVar134._8_4_ + fStack_78;
  auVar147._12_4_ = auVar134._12_4_ + fStack_74;
  auVar147._16_4_ = auVar134._16_4_ + fStack_70;
  auVar147._20_4_ = auVar134._20_4_ + fStack_6c;
  auVar147._24_4_ = auVar134._24_4_ + fStack_68;
  auVar147._28_4_ = auVar134._28_4_ + fStack_64;
  auVar116 = vaddps_avx512vl(auVar113,auVar116);
  auVar151._0_4_ = auVar112._0_4_ + (float)local_c0._0_4_;
  auVar151._4_4_ = auVar112._4_4_ + (float)local_c0._4_4_;
  auVar151._8_4_ = auVar112._8_4_ + fStack_b8;
  auVar151._12_4_ = auVar112._12_4_ + fStack_b4;
  auVar151._16_4_ = auVar112._16_4_ + fStack_b0;
  auVar151._20_4_ = auVar112._20_4_ + fStack_ac;
  auVar151._24_4_ = auVar112._24_4_ + fStack_a8;
  auVar151._28_4_ = auVar112._28_4_ + fStack_a4;
  auVar134 = vmulps_avx512vl(auVar127,auVar107);
  auVar112 = vmulps_avx512vl(auVar155,auVar107);
  auVar195._0_4_ = auVar107._0_4_ * auVar159._0_4_;
  auVar195._4_4_ = auVar107._4_4_ * auVar159._4_4_;
  auVar195._8_4_ = auVar107._8_4_ * auVar159._8_4_;
  auVar195._12_4_ = auVar107._12_4_ * auVar159._12_4_;
  auVar195._16_4_ = auVar107._16_4_ * auVar159._16_4_;
  auVar195._20_4_ = auVar107._20_4_ * auVar159._20_4_;
  auVar195._24_4_ = auVar107._24_4_ * auVar159._24_4_;
  auVar195._28_36_ = auVar158;
  bVar96 = (byte)uVar98;
  bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
  bVar21 = (bool)((byte)(uVar98 >> 2) & 1);
  bVar44 = (bool)((byte)(uVar98 >> 3) & 1);
  bVar27 = (bool)((byte)(uVar98 >> 4) & 1);
  bVar36 = (bool)((byte)(uVar98 >> 5) & 1);
  bVar46 = (bool)((byte)(uVar98 >> 6) & 1);
  bVar56 = SUB81(uVar98 >> 7,0);
  bVar15 = (bool)((byte)(uVar98 >> 1) & 1);
  bVar22 = (bool)((byte)(uVar98 >> 2) & 1);
  bVar53 = (bool)((byte)(uVar98 >> 3) & 1);
  bVar28 = (bool)((byte)(uVar98 >> 4) & 1);
  bVar37 = (bool)((byte)(uVar98 >> 5) & 1);
  bVar47 = (bool)((byte)(uVar98 >> 6) & 1);
  bVar57 = SUB81(uVar98 >> 7,0);
  bVar16 = (bool)((byte)(uVar98 >> 1) & 1);
  bVar25 = (bool)((byte)(uVar98 >> 2) & 1);
  bVar54 = (bool)((byte)(uVar98 >> 3) & 1);
  bVar29 = (bool)((byte)(uVar98 >> 4) & 1);
  bVar38 = (bool)((byte)(uVar98 >> 5) & 1);
  bVar48 = (bool)((byte)(uVar98 >> 6) & 1);
  bVar58 = SUB81(uVar98 >> 7,0);
  auVar134 = vsubps_avx512vl(auVar147,auVar134);
  bVar17 = (bool)(bVar89 >> 1 & 1);
  bVar26 = (bool)(bVar89 >> 2 & 1);
  bVar45 = (bool)(bVar89 >> 3 & 1);
  bVar30 = (bool)(bVar89 >> 4 & 1);
  bVar39 = (bool)(bVar89 >> 5 & 1);
  bVar49 = (bool)(bVar89 >> 6 & 1);
  auVar116 = vsubps_avx512vl(auVar116,auVar112);
  bVar18 = (bool)(bVar89 >> 1 & 1);
  bVar34 = (bool)(bVar89 >> 2 & 1);
  bVar55 = (bool)(bVar89 >> 3 & 1);
  bVar31 = (bool)(bVar89 >> 4 & 1);
  bVar40 = (bool)(bVar89 >> 5 & 1);
  bVar50 = (bool)(bVar89 >> 6 & 1);
  auVar112 = vsubps_avx512vl(auVar151,auVar195._0_32_);
  bVar19 = (bool)(bVar89 >> 1 & 1);
  bVar35 = (bool)(bVar89 >> 2 & 1);
  bVar23 = (bool)(bVar89 >> 3 & 1);
  bVar32 = (bool)(bVar89 >> 4 & 1);
  bVar41 = (bool)(bVar89 >> 5 & 1);
  bVar51 = (bool)(bVar89 >> 6 & 1);
  auVar109 = vmulps_avx512vl(auVar107,auVar109);
  bVar20 = (bool)(bVar89 >> 1 & 1);
  bVar43 = (bool)(bVar89 >> 2 & 1);
  bVar24 = (bool)(bVar89 >> 3 & 1);
  bVar33 = (bool)(bVar89 >> 4 & 1);
  bVar42 = (bool)(bVar89 >> 5 & 1);
  bVar52 = (bool)(bVar89 >> 6 & 1);
  local_500[0] = (uint)(bVar89 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar89 & 1) * auVar160._0_4_;
  local_500[1] = (uint)bVar20 * auVar109._4_4_ | (uint)!bVar20 * auVar160._4_4_;
  local_500[2] = (uint)bVar43 * auVar109._8_4_ | (uint)!bVar43 * auVar160._8_4_;
  local_500[3] = (uint)bVar24 * auVar109._12_4_ | (uint)!bVar24 * auVar160._12_4_;
  uStack_4f0 = (uint)bVar33 * auVar109._16_4_ | (uint)!bVar33 * auVar160._16_4_;
  uStack_4ec = (uint)bVar42 * auVar109._20_4_ | (uint)!bVar42 * auVar160._20_4_;
  uStack_4e8 = (uint)bVar52 * auVar109._24_4_ | (uint)!bVar52 * auVar160._24_4_;
  uStack_4e4 = (uint)(bVar89 >> 7) * auVar109._28_4_ | (uint)!(bool)(bVar89 >> 7) * auVar160._28_4_;
  local_4e0 = ZEXT432(0) << 0x20;
  local_4a0[0] = (uint)(bVar89 & 1) * auVar134._0_4_ |
                 (uint)!(bool)(bVar89 & 1) *
                 ((uint)(bVar96 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar111._0_4_);
  local_4a0[1] = (uint)bVar17 * auVar134._4_4_ |
                 (uint)!bVar17 * ((uint)bVar14 * auVar117._4_4_ | (uint)!bVar14 * auVar111._4_4_);
  local_4a0[2] = (uint)bVar26 * auVar134._8_4_ |
                 (uint)!bVar26 * ((uint)bVar21 * auVar117._8_4_ | (uint)!bVar21 * auVar111._8_4_);
  local_4a0[3] = (uint)bVar45 * auVar134._12_4_ |
                 (uint)!bVar45 * ((uint)bVar44 * auVar117._12_4_ | (uint)!bVar44 * auVar111._12_4_);
  uStack_490 = (uint)bVar30 * auVar134._16_4_ |
               (uint)!bVar30 * ((uint)bVar27 * auVar117._16_4_ | (uint)!bVar27 * auVar111._16_4_);
  uStack_48c = (uint)bVar39 * auVar134._20_4_ |
               (uint)!bVar39 * ((uint)bVar36 * auVar117._20_4_ | (uint)!bVar36 * auVar111._20_4_);
  uStack_488 = (uint)bVar49 * auVar134._24_4_ |
               (uint)!bVar49 * ((uint)bVar46 * auVar117._24_4_ | (uint)!bVar46 * auVar111._24_4_);
  uStack_484 = (uint)(bVar89 >> 7) * auVar134._28_4_ |
               (uint)!(bool)(bVar89 >> 7) *
               ((uint)bVar56 * auVar117._28_4_ | (uint)!bVar56 * auVar111._28_4_);
  local_480[0] = (uint)(bVar89 & 1) * auVar116._0_4_ |
                 (uint)!(bool)(bVar89 & 1) *
                 ((uint)(bVar96 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar114._0_4_);
  local_480[1] = (uint)bVar18 * auVar116._4_4_ |
                 (uint)!bVar18 * ((uint)bVar15 * auVar108._4_4_ | (uint)!bVar15 * auVar114._4_4_);
  local_480[2] = (uint)bVar34 * auVar116._8_4_ |
                 (uint)!bVar34 * ((uint)bVar22 * auVar108._8_4_ | (uint)!bVar22 * auVar114._8_4_);
  local_480[3] = (uint)bVar55 * auVar116._12_4_ |
                 (uint)!bVar55 * ((uint)bVar53 * auVar108._12_4_ | (uint)!bVar53 * auVar114._12_4_);
  uStack_470 = (uint)bVar31 * auVar116._16_4_ |
               (uint)!bVar31 * ((uint)bVar28 * auVar108._16_4_ | (uint)!bVar28 * auVar114._16_4_);
  uStack_46c = (uint)bVar40 * auVar116._20_4_ |
               (uint)!bVar40 * ((uint)bVar37 * auVar108._20_4_ | (uint)!bVar37 * auVar114._20_4_);
  uStack_468 = (uint)bVar50 * auVar116._24_4_ |
               (uint)!bVar50 * ((uint)bVar47 * auVar108._24_4_ | (uint)!bVar47 * auVar114._24_4_);
  uStack_464 = (uint)(bVar89 >> 7) * auVar116._28_4_ |
               (uint)!(bool)(bVar89 >> 7) *
               ((uint)bVar57 * auVar108._28_4_ | (uint)!bVar57 * auVar114._28_4_);
  local_460[0] = (uint)(bVar89 & 1) * auVar112._0_4_ |
                 (uint)!(bool)(bVar89 & 1) *
                 ((uint)(bVar96 & 1) * local_a0._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar115._0_4_);
  local_460[1] = (uint)bVar19 * auVar112._4_4_ |
                 (uint)!bVar19 * ((uint)bVar16 * local_a0._4_4_ | (uint)!bVar16 * auVar115._4_4_);
  local_460[2] = (uint)bVar35 * auVar112._8_4_ |
                 (uint)!bVar35 * ((uint)bVar25 * local_a0._8_4_ | (uint)!bVar25 * auVar115._8_4_);
  local_460[3] = (uint)bVar23 * auVar112._12_4_ |
                 (uint)!bVar23 * ((uint)bVar54 * local_a0._12_4_ | (uint)!bVar54 * auVar115._12_4_);
  uStack_450 = (uint)bVar32 * auVar112._16_4_ |
               (uint)!bVar32 * ((uint)bVar29 * local_a0._16_4_ | (uint)!bVar29 * auVar115._16_4_);
  uStack_44c = (uint)bVar41 * auVar112._20_4_ |
               (uint)!bVar41 * ((uint)bVar38 * local_a0._20_4_ | (uint)!bVar38 * auVar115._20_4_);
  uStack_448 = (uint)bVar51 * auVar112._24_4_ |
               (uint)!bVar51 * ((uint)bVar48 * local_a0._24_4_ | (uint)!bVar48 * auVar115._24_4_);
  uStack_444 = (uint)(bVar89 >> 7) * auVar112._28_4_ |
               (uint)!(bool)(bVar89 >> 7) *
               ((uint)bVar58 * local_a0._28_4_ | (uint)!bVar58 * auVar115._28_4_);
  auVar93 = (undefined1  [8])context->scene;
  auVar108 = vblendmps_avx512vl(auVar193._0_32_,local_4c0);
  auVar136._4_4_ = (uint)(bVar90 >> 1 & 1) * auVar108._4_4_;
  auVar136._0_4_ = (uint)(bVar90 & 1) * auVar108._0_4_;
  auVar136._8_4_ = (uint)(bVar90 >> 2 & 1) * auVar108._8_4_;
  auVar136._12_4_ = (uint)(bVar90 >> 3 & 1) * auVar108._12_4_;
  auVar136._16_4_ = (uint)(bVar90 >> 4 & 1) * auVar108._16_4_;
  auVar136._20_4_ = (uint)(bVar90 >> 5 & 1) * auVar108._20_4_;
  auVar136._24_4_ = (uint)(bVar90 >> 6 & 1) * auVar108._24_4_;
  auVar136._28_4_ = (uint)(bVar90 >> 7) * auVar108._28_4_;
  auVar108 = vshufps_avx(auVar136,auVar136,0xb1);
  auVar108 = vminps_avx(auVar136,auVar108);
  auVar109 = vshufpd_avx(auVar108,auVar108,5);
  auVar108 = vminps_avx(auVar108,auVar109);
  auVar109 = vpermpd_avx2(auVar108,0x4e);
  auVar108 = vminps_avx(auVar108,auVar109);
  uVar77 = vcmpps_avx512vl(auVar136,auVar108,0);
  if (((byte)uVar77 & bVar90) != 0) {
    bVar90 = (byte)uVar77 & bVar90;
  }
  uVar91 = 0;
  for (uVar92 = (uint)bVar90; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
    uVar91 = uVar91 + 1;
  }
  auVar107 = vpcmpeqd_avx2(auVar107,auVar107);
  auVar195 = ZEXT3264(auVar107);
  do {
    local_5c0.hit = local_440;
    local_5c0.valid = (int *)local_5e0;
    uVar94 = uVar91 & 0xff;
    uVar92 = *(uint *)(local_e0 + (ulong)uVar94 * 4);
    pGVar11 = (((Scene *)auVar93)->geometries).items[uVar92].ptr;
    if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
      uVar101 = (ulong)(byte)(~(byte)(1 << (uVar91 & 0x1f)) & (byte)uVar101);
      auVar107 = auVar136;
    }
    else {
      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
         (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
        uVar101 = (ulong)(uVar94 << 2);
        uVar144 = *(undefined4 *)((long)local_500 + uVar101);
        uVar4 = *(undefined4 *)(local_4e0 + uVar101);
        *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_4c0 + uVar101);
        *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)local_4a0 + uVar101);
        *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)local_480 + uVar101);
        *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)local_460 + uVar101);
        *(undefined4 *)(ray + k * 4 + 0xf0) = uVar144;
        *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
        *(undefined4 *)(ray + k * 4 + 0x110) =
             *(undefined4 *)((long)&(line->primIDs).field_0 + uVar101);
        *(uint *)(ray + k * 4 + 0x120) = uVar92;
        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
        return;
      }
      uVar98 = (ulong)(uVar94 * 4);
      local_410 = *(undefined4 *)((long)local_500 + uVar98);
      local_400 = *(undefined4 *)(local_4e0 + uVar98);
      local_3e0 = vpbroadcastd_avx512vl();
      uVar144 = *(undefined4 *)((long)&(line->primIDs).field_0 + uVar98);
      local_3f0._4_4_ = uVar144;
      local_3f0._0_4_ = uVar144;
      local_3f0._8_4_ = uVar144;
      local_3f0._12_4_ = uVar144;
      uVar144 = *(undefined4 *)((long)local_4a0 + uVar98);
      uVar4 = *(undefined4 *)((long)local_480 + uVar98);
      local_430._4_4_ = uVar4;
      local_430._0_4_ = uVar4;
      local_430._8_4_ = uVar4;
      local_430._12_4_ = uVar4;
      uVar4 = *(undefined4 *)((long)local_460 + uVar98);
      local_420._4_4_ = uVar4;
      local_420._0_4_ = uVar4;
      local_420._8_4_ = uVar4;
      local_420._12_4_ = uVar4;
      local_440[0] = (RTCHitN)(char)uVar144;
      local_440[1] = (RTCHitN)(char)((uint)uVar144 >> 8);
      local_440[2] = (RTCHitN)(char)((uint)uVar144 >> 0x10);
      local_440[3] = (RTCHitN)(char)((uint)uVar144 >> 0x18);
      local_440[4] = (RTCHitN)(char)uVar144;
      local_440[5] = (RTCHitN)(char)((uint)uVar144 >> 8);
      local_440[6] = (RTCHitN)(char)((uint)uVar144 >> 0x10);
      local_440[7] = (RTCHitN)(char)((uint)uVar144 >> 0x18);
      local_440[8] = (RTCHitN)(char)uVar144;
      local_440[9] = (RTCHitN)(char)((uint)uVar144 >> 8);
      local_440[10] = (RTCHitN)(char)((uint)uVar144 >> 0x10);
      local_440[0xb] = (RTCHitN)(char)((uint)uVar144 >> 0x18);
      local_440[0xc] = (RTCHitN)(char)uVar144;
      local_440[0xd] = (RTCHitN)(char)((uint)uVar144 >> 8);
      local_440[0xe] = (RTCHitN)(char)((uint)uVar144 >> 0x10);
      local_440[0xf] = (RTCHitN)(char)((uint)uVar144 >> 0x18);
      uStack_40c = local_410;
      uStack_408 = local_410;
      uStack_404 = local_410;
      uStack_3fc = local_400;
      uStack_3f8 = local_400;
      uStack_3f4 = local_400;
      uStack_3cc = context->user->instID[0];
      local_3d0 = uStack_3cc;
      uStack_3c8 = uStack_3cc;
      uStack_3c4 = uStack_3cc;
      uStack_3c0 = context->user->instPrimID[0];
      uStack_3bc = uStack_3c0;
      uStack_3b8 = uStack_3c0;
      uStack_3b4 = uStack_3c0;
      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_4c0 + uVar98);
      local_5e0 = auVar164._0_16_;
      local_5c0.geometryUserPtr = pGVar11->userPtr;
      local_5c0.context = context->user;
      local_5c0.N = 4;
      local_520 = auVar174._0_32_;
      _local_580 = auVar194._0_16_;
      local_540 = auVar93;
      local_5c0.ray = (RTCRayN *)ray;
      local_590 = local_5e0;
      if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
        auVar107 = ZEXT1632(auVar195._0_16_);
        local_5c8 = line;
        (*pGVar11->intersectionFilterN)(&local_5c0);
        auVar107 = vpcmpeqd_avx2(auVar107,auVar107);
        auVar195 = ZEXT3264(auVar107);
        auVar194 = ZEXT1664(_local_580);
        auVar164 = ZEXT1664(local_590);
        auVar174 = ZEXT3264(local_520);
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar193 = ZEXT3264(auVar107);
        line = local_5c8;
        auVar93 = local_540;
      }
      uVar98 = vptestmd_avx512vl(local_5e0,local_5e0);
      if ((uVar98 & 0xf) == 0) {
LAB_01982059:
        *(int *)(ray + k * 4 + 0x80) = auVar194._0_4_;
      }
      else {
        p_Var13 = context->args->filter;
        if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
             RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
          auVar107 = ZEXT1632(auVar195._0_16_);
          (*p_Var13)(&local_5c0);
          auVar107 = vpcmpeqd_avx2(auVar107,auVar107);
          auVar195 = ZEXT3264(auVar107);
          auVar194 = ZEXT1664(_local_580);
          auVar164 = ZEXT1664(local_590);
          auVar174 = ZEXT3264(local_520);
          auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar193 = ZEXT3264(auVar107);
          auVar93 = local_540;
        }
        uVar98 = vptestmd_avx512vl(local_5e0,local_5e0);
        uVar98 = uVar98 & 0xf;
        bVar90 = (byte)uVar98;
        if (bVar90 == 0) goto LAB_01982059;
        iVar102 = *(int *)(local_5c0.hit + 4);
        iVar137 = *(int *)(local_5c0.hit + 8);
        iVar138 = *(int *)(local_5c0.hit + 0xc);
        bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar98 >> 2) & 1);
        bVar16 = SUB81(uVar98 >> 3,0);
        *(uint *)(local_5c0.ray + 0xc0) =
             (uint)(bVar90 & 1) * *(int *)local_5c0.hit |
             (uint)!(bool)(bVar90 & 1) * *(int *)(local_5c0.ray + 0xc0);
        *(uint *)(local_5c0.ray + 0xc4) =
             (uint)bVar14 * iVar102 | (uint)!bVar14 * *(int *)(local_5c0.ray + 0xc4);
        *(uint *)(local_5c0.ray + 200) =
             (uint)bVar15 * iVar137 | (uint)!bVar15 * *(int *)(local_5c0.ray + 200);
        *(uint *)(local_5c0.ray + 0xcc) =
             (uint)bVar16 * iVar138 | (uint)!bVar16 * *(int *)(local_5c0.ray + 0xcc);
        iVar102 = *(int *)(local_5c0.hit + 0x14);
        iVar137 = *(int *)(local_5c0.hit + 0x18);
        iVar138 = *(int *)(local_5c0.hit + 0x1c);
        bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar98 >> 2) & 1);
        bVar16 = SUB81(uVar98 >> 3,0);
        *(uint *)(local_5c0.ray + 0xd0) =
             (uint)(bVar90 & 1) * *(int *)(local_5c0.hit + 0x10) |
             (uint)!(bool)(bVar90 & 1) * *(int *)(local_5c0.ray + 0xd0);
        *(uint *)(local_5c0.ray + 0xd4) =
             (uint)bVar14 * iVar102 | (uint)!bVar14 * *(int *)(local_5c0.ray + 0xd4);
        *(uint *)(local_5c0.ray + 0xd8) =
             (uint)bVar15 * iVar137 | (uint)!bVar15 * *(int *)(local_5c0.ray + 0xd8);
        *(uint *)(local_5c0.ray + 0xdc) =
             (uint)bVar16 * iVar138 | (uint)!bVar16 * *(int *)(local_5c0.ray + 0xdc);
        iVar102 = *(int *)(local_5c0.hit + 0x24);
        iVar137 = *(int *)(local_5c0.hit + 0x28);
        iVar138 = *(int *)(local_5c0.hit + 0x2c);
        bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar98 >> 2) & 1);
        bVar16 = SUB81(uVar98 >> 3,0);
        *(uint *)(local_5c0.ray + 0xe0) =
             (uint)(bVar90 & 1) * *(int *)(local_5c0.hit + 0x20) |
             (uint)!(bool)(bVar90 & 1) * *(int *)(local_5c0.ray + 0xe0);
        *(uint *)(local_5c0.ray + 0xe4) =
             (uint)bVar14 * iVar102 | (uint)!bVar14 * *(int *)(local_5c0.ray + 0xe4);
        *(uint *)(local_5c0.ray + 0xe8) =
             (uint)bVar15 * iVar137 | (uint)!bVar15 * *(int *)(local_5c0.ray + 0xe8);
        *(uint *)(local_5c0.ray + 0xec) =
             (uint)bVar16 * iVar138 | (uint)!bVar16 * *(int *)(local_5c0.ray + 0xec);
        iVar102 = *(int *)(local_5c0.hit + 0x34);
        iVar137 = *(int *)(local_5c0.hit + 0x38);
        iVar138 = *(int *)(local_5c0.hit + 0x3c);
        bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar98 >> 2) & 1);
        bVar16 = SUB81(uVar98 >> 3,0);
        *(uint *)(local_5c0.ray + 0xf0) =
             (uint)(bVar90 & 1) * *(int *)(local_5c0.hit + 0x30) |
             (uint)!(bool)(bVar90 & 1) * *(int *)(local_5c0.ray + 0xf0);
        *(uint *)(local_5c0.ray + 0xf4) =
             (uint)bVar14 * iVar102 | (uint)!bVar14 * *(int *)(local_5c0.ray + 0xf4);
        *(uint *)(local_5c0.ray + 0xf8) =
             (uint)bVar15 * iVar137 | (uint)!bVar15 * *(int *)(local_5c0.ray + 0xf8);
        *(uint *)(local_5c0.ray + 0xfc) =
             (uint)bVar16 * iVar138 | (uint)!bVar16 * *(int *)(local_5c0.ray + 0xfc);
        iVar102 = *(int *)(local_5c0.hit + 0x44);
        iVar137 = *(int *)(local_5c0.hit + 0x48);
        iVar138 = *(int *)(local_5c0.hit + 0x4c);
        bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar98 >> 2) & 1);
        bVar16 = SUB81(uVar98 >> 3,0);
        *(uint *)(local_5c0.ray + 0x100) =
             (uint)(bVar90 & 1) * *(int *)(local_5c0.hit + 0x40) |
             (uint)!(bool)(bVar90 & 1) * *(int *)(local_5c0.ray + 0x100);
        *(uint *)(local_5c0.ray + 0x104) =
             (uint)bVar14 * iVar102 | (uint)!bVar14 * *(int *)(local_5c0.ray + 0x104);
        *(uint *)(local_5c0.ray + 0x108) =
             (uint)bVar15 * iVar137 | (uint)!bVar15 * *(int *)(local_5c0.ray + 0x108);
        *(uint *)(local_5c0.ray + 0x10c) =
             (uint)bVar16 * iVar138 | (uint)!bVar16 * *(int *)(local_5c0.ray + 0x10c);
        auVar103 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_5c0.hit + 0x50));
        *(undefined1 (*) [16])(local_5c0.ray + 0x110) = auVar103;
        auVar103 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_5c0.hit + 0x60));
        *(undefined1 (*) [16])(local_5c0.ray + 0x120) = auVar103;
        auVar103 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_5c0.hit + 0x70));
        *(undefined1 (*) [16])(local_5c0.ray + 0x130) = auVar103;
        auVar103 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_5c0.hit + 0x80));
        *(undefined1 (*) [16])(local_5c0.ray + 0x140) = auVar103;
        auVar194 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
      }
      auVar107 = vbroadcastss_avx512vl(auVar194._0_16_);
      uVar98 = vcmpps_avx512vl(auVar174._0_32_,auVar107,2);
      uVar101 = (byte)(~(byte)(1 << (uVar91 & 0x1f)) & (byte)uVar101) & uVar98;
    }
    bVar90 = (byte)uVar101;
    if (bVar90 == 0) {
      return;
    }
    auVar108 = vblendmps_avx512vl(auVar193._0_32_,auVar174._0_32_);
    auVar136._0_4_ =
         (uint)(bVar90 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar90 & 1) * auVar107._0_4_;
    bVar14 = (bool)((byte)(uVar101 >> 1) & 1);
    auVar136._4_4_ = (uint)bVar14 * auVar108._4_4_ | (uint)!bVar14 * auVar107._4_4_;
    bVar14 = (bool)((byte)(uVar101 >> 2) & 1);
    auVar136._8_4_ = (uint)bVar14 * auVar108._8_4_ | (uint)!bVar14 * auVar107._8_4_;
    bVar14 = (bool)((byte)(uVar101 >> 3) & 1);
    auVar136._12_4_ = (uint)bVar14 * auVar108._12_4_ | (uint)!bVar14 * auVar107._12_4_;
    bVar14 = (bool)((byte)(uVar101 >> 4) & 1);
    auVar136._16_4_ = (uint)bVar14 * auVar108._16_4_ | (uint)!bVar14 * auVar107._16_4_;
    bVar14 = (bool)((byte)(uVar101 >> 5) & 1);
    auVar136._20_4_ = (uint)bVar14 * auVar108._20_4_ | (uint)!bVar14 * auVar107._20_4_;
    bVar14 = (bool)((byte)(uVar101 >> 6) & 1);
    auVar136._24_4_ = (uint)bVar14 * auVar108._24_4_ | (uint)!bVar14 * auVar107._24_4_;
    bVar14 = SUB81(uVar101 >> 7,0);
    auVar136._28_4_ = (uint)bVar14 * auVar108._28_4_ | (uint)!bVar14 * auVar107._28_4_;
    auVar107 = vshufps_avx(auVar136,auVar136,0xb1);
    auVar107 = vminps_avx(auVar136,auVar107);
    auVar108 = vshufpd_avx(auVar107,auVar107,5);
    auVar107 = vminps_avx(auVar107,auVar108);
    auVar108 = vpermpd_avx2(auVar107,0x4e);
    auVar107 = vminps_avx(auVar107,auVar108);
    uVar77 = vcmpps_avx512vl(auVar136,auVar107,0);
    bVar90 = (byte)uVar77 & bVar90;
    uVar92 = (uint)uVar101;
    if (bVar90 != 0) {
      uVar92 = (uint)bVar90;
    }
    uVar91 = 0;
    for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
      uVar91 = uVar91 + 1;
    }
  } while( true );
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Intersect1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }